

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx::CurveNvIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  uint uVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  long lVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  long lVar76;
  ulong uVar77;
  undefined1 (*pauVar78) [32];
  uint uVar79;
  uint uVar80;
  uint uVar81;
  ulong uVar82;
  ulong uVar83;
  int iVar84;
  float fVar108;
  float fVar109;
  vint4 bi_2;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar110;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar95 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar114;
  float fVar115;
  float fVar135;
  float fVar137;
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar139;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar146;
  float fVar170;
  float fVar171;
  vint4 ai;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar172;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar153 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar158 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar173;
  float fVar191;
  float fVar192;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [28];
  float fVar193;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  vint4 bi;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  float fVar220;
  float fVar221;
  vint4 ai_2;
  undefined1 auVar208 [16];
  float fVar222;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar223;
  float fVar229;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar226;
  float fVar228;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar224;
  float fVar225;
  float fVar227;
  undefined1 auVar219 [64];
  float fVar230;
  float fVar231;
  float fVar243;
  float fVar247;
  undefined1 auVar232 [16];
  float fVar251;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar244;
  float fVar245;
  float fVar248;
  float fVar249;
  float fVar252;
  float fVar253;
  float fVar256;
  float fVar259;
  float fVar262;
  undefined1 auVar236 [32];
  float fVar246;
  float fVar250;
  float fVar254;
  float fVar257;
  float fVar260;
  float fVar263;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar255;
  float fVar258;
  float fVar261;
  undefined1 auVar242 [64];
  float fVar264;
  float fVar271;
  float fVar272;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  float fVar274;
  undefined1 auVar268 [32];
  float fVar273;
  float fVar275;
  float fVar277;
  float fVar279;
  float fVar281;
  undefined1 auVar269 [32];
  float fVar276;
  float fVar278;
  float fVar280;
  undefined1 auVar270 [64];
  float fVar282;
  float fVar289;
  float fVar290;
  vint4 ai_1;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar296;
  float fVar302;
  float fVar304;
  undefined1 auVar298 [16];
  float fVar297;
  undefined1 auVar299 [16];
  float fVar303;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar309;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar300 [32];
  float fVar308;
  float fVar310;
  float fVar312;
  undefined1 auVar301 [64];
  float fVar322;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [64];
  float fVar323;
  float fVar333;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar326 [64];
  float fVar334;
  float fVar339;
  float fVar340;
  undefined1 auVar335 [16];
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar345;
  float fVar352;
  float fVar353;
  undefined1 auVar346 [16];
  undefined1 auVar347 [28];
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar358 [32];
  float fVar361;
  float fVar362;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_aec;
  float local_ae0;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a58;
  int local_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined8 local_960;
  float local_958;
  float local_954;
  undefined4 local_950;
  uint local_94c;
  uint local_948;
  uint local_944;
  uint local_940;
  Primitive *local_928;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_850 [16];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined4 uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar338 [64];
  
  PVar5 = prim[1];
  uVar83 = (ulong)(byte)PVar5;
  lVar67 = uVar83 * 0x19;
  fVar207 = *(float *)(prim + lVar67 + 0x12);
  auVar96 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar67 + 6));
  auVar265._0_4_ = fVar207 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar265._4_4_ = fVar207 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar265._8_4_ = fVar207 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar265._12_4_ = fVar207 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar147._0_4_ = fVar207 * auVar96._0_4_;
  auVar147._4_4_ = fVar207 * auVar96._4_4_;
  auVar147._8_4_ = fVar207 * auVar96._8_4_;
  auVar147._12_4_ = fVar207 * auVar96._12_4_;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar154 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar154 = vcvtdq2ps_avx(auVar154);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar299 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar5 * 0xc + uVar83 + 6)));
  auVar299 = vcvtdq2ps_avx(auVar299);
  uVar82 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + uVar83 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar82 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar321 = ZEXT1664(auVar117);
  auVar94 = vshufps_avx(auVar265,auVar265,0);
  auVar116 = vshufps_avx(auVar265,auVar265,0x55);
  auVar148 = vshufps_avx(auVar265,auVar265,0xaa);
  fVar207 = auVar148._0_4_;
  fVar173 = auVar148._4_4_;
  fVar220 = auVar148._8_4_;
  fVar191 = auVar148._12_4_;
  fVar230 = auVar116._0_4_;
  fVar243 = auVar116._4_4_;
  fVar247 = auVar116._8_4_;
  fVar251 = auVar116._12_4_;
  fVar221 = auVar94._0_4_;
  fVar192 = auVar94._4_4_;
  fVar222 = auVar94._8_4_;
  fVar193 = auVar94._12_4_;
  auVar335._0_4_ = fVar221 * auVar96._0_4_ + fVar230 * auVar90._0_4_ + fVar207 * auVar154._0_4_;
  auVar335._4_4_ = fVar192 * auVar96._4_4_ + fVar243 * auVar90._4_4_ + fVar173 * auVar154._4_4_;
  auVar335._8_4_ = fVar222 * auVar96._8_4_ + fVar247 * auVar90._8_4_ + fVar220 * auVar154._8_4_;
  auVar335._12_4_ = fVar193 * auVar96._12_4_ + fVar251 * auVar90._12_4_ + fVar191 * auVar154._12_4_;
  auVar338 = ZEXT1664(auVar335);
  auVar346._0_4_ = fVar221 * auVar155._0_4_ + fVar230 * auVar92._0_4_ + auVar299._0_4_ * fVar207;
  auVar346._4_4_ = fVar192 * auVar155._4_4_ + fVar243 * auVar92._4_4_ + auVar299._4_4_ * fVar173;
  auVar346._8_4_ = fVar222 * auVar155._8_4_ + fVar247 * auVar92._8_4_ + auVar299._8_4_ * fVar220;
  auVar346._12_4_ = fVar193 * auVar155._12_4_ + fVar251 * auVar92._12_4_ + auVar299._12_4_ * fVar191
  ;
  auVar266._0_4_ = fVar221 * auVar85._0_4_ + fVar230 * auVar91._0_4_ + auVar117._0_4_ * fVar207;
  auVar266._4_4_ = fVar192 * auVar85._4_4_ + fVar243 * auVar91._4_4_ + auVar117._4_4_ * fVar173;
  auVar266._8_4_ = fVar222 * auVar85._8_4_ + fVar247 * auVar91._8_4_ + auVar117._8_4_ * fVar220;
  auVar266._12_4_ = fVar193 * auVar85._12_4_ + fVar251 * auVar91._12_4_ + auVar117._12_4_ * fVar191;
  auVar94 = vshufps_avx(auVar147,auVar147,0);
  auVar326 = ZEXT1664(auVar94);
  auVar116 = vshufps_avx(auVar147,auVar147,0x55);
  auVar148 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar207 = auVar148._0_4_;
  fVar173 = auVar148._4_4_;
  fVar220 = auVar148._8_4_;
  fVar191 = auVar148._12_4_;
  fVar230 = auVar116._0_4_;
  fVar243 = auVar116._4_4_;
  fVar247 = auVar116._8_4_;
  fVar251 = auVar116._12_4_;
  fVar221 = auVar94._0_4_;
  fVar192 = auVar94._4_4_;
  fVar222 = auVar94._8_4_;
  fVar193 = auVar94._12_4_;
  auVar194._0_4_ = fVar221 * auVar96._0_4_ + fVar230 * auVar90._0_4_ + fVar207 * auVar154._0_4_;
  auVar194._4_4_ = fVar192 * auVar96._4_4_ + fVar243 * auVar90._4_4_ + fVar173 * auVar154._4_4_;
  auVar194._8_4_ = fVar222 * auVar96._8_4_ + fVar247 * auVar90._8_4_ + fVar220 * auVar154._8_4_;
  auVar194._12_4_ = fVar193 * auVar96._12_4_ + fVar251 * auVar90._12_4_ + fVar191 * auVar154._12_4_;
  auVar116._0_4_ = fVar221 * auVar155._0_4_ + auVar299._0_4_ * fVar207 + fVar230 * auVar92._0_4_;
  auVar116._4_4_ = fVar192 * auVar155._4_4_ + auVar299._4_4_ * fVar173 + fVar243 * auVar92._4_4_;
  auVar116._8_4_ = fVar222 * auVar155._8_4_ + auVar299._8_4_ * fVar220 + fVar247 * auVar92._8_4_;
  auVar116._12_4_ = fVar193 * auVar155._12_4_ + auVar299._12_4_ * fVar191 + fVar251 * auVar92._12_4_
  ;
  auVar94._0_4_ = fVar221 * auVar85._0_4_ + fVar230 * auVar91._0_4_ + auVar117._0_4_ * fVar207;
  auVar94._4_4_ = fVar192 * auVar85._4_4_ + fVar243 * auVar91._4_4_ + auVar117._4_4_ * fVar173;
  auVar94._8_4_ = fVar222 * auVar85._8_4_ + fVar247 * auVar91._8_4_ + auVar117._8_4_ * fVar220;
  auVar94._12_4_ = fVar193 * auVar85._12_4_ + fVar251 * auVar91._12_4_ + auVar117._12_4_ * fVar191;
  auVar232._8_4_ = 0x7fffffff;
  auVar232._0_8_ = 0x7fffffff7fffffff;
  auVar232._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar335,auVar232);
  auVar174._8_4_ = 0x219392ef;
  auVar174._0_8_ = 0x219392ef219392ef;
  auVar174._12_4_ = 0x219392ef;
  auVar96 = vcmpps_avx(auVar96,auVar174,1);
  auVar90 = vblendvps_avx(auVar335,auVar174,auVar96);
  auVar96 = vandps_avx(auVar346,auVar232);
  auVar96 = vcmpps_avx(auVar96,auVar174,1);
  auVar154 = vblendvps_avx(auVar346,auVar174,auVar96);
  auVar96 = vandps_avx(auVar266,auVar232);
  auVar96 = vcmpps_avx(auVar96,auVar174,1);
  auVar96 = vblendvps_avx(auVar266,auVar174,auVar96);
  auVar155 = vrcpps_avx(auVar90);
  fVar230 = auVar155._0_4_;
  auVar148._0_4_ = fVar230 * auVar90._0_4_;
  fVar243 = auVar155._4_4_;
  auVar148._4_4_ = fVar243 * auVar90._4_4_;
  fVar247 = auVar155._8_4_;
  auVar148._8_4_ = fVar247 * auVar90._8_4_;
  fVar251 = auVar155._12_4_;
  auVar148._12_4_ = fVar251 * auVar90._12_4_;
  auVar267._8_4_ = 0x3f800000;
  auVar267._0_8_ = 0x3f8000003f800000;
  auVar267._12_4_ = 0x3f800000;
  auVar90 = vsubps_avx(auVar267,auVar148);
  fVar230 = fVar230 + fVar230 * auVar90._0_4_;
  fVar243 = fVar243 + fVar243 * auVar90._4_4_;
  fVar247 = fVar247 + fVar247 * auVar90._8_4_;
  fVar251 = fVar251 + fVar251 * auVar90._12_4_;
  auVar90 = vrcpps_avx(auVar154);
  fVar207 = auVar90._0_4_;
  auVar208._0_4_ = fVar207 * auVar154._0_4_;
  fVar220 = auVar90._4_4_;
  auVar208._4_4_ = fVar220 * auVar154._4_4_;
  fVar221 = auVar90._8_4_;
  auVar208._8_4_ = fVar221 * auVar154._8_4_;
  fVar222 = auVar90._12_4_;
  auVar208._12_4_ = fVar222 * auVar154._12_4_;
  auVar90 = vsubps_avx(auVar267,auVar208);
  fVar207 = fVar207 + fVar207 * auVar90._0_4_;
  fVar220 = fVar220 + fVar220 * auVar90._4_4_;
  fVar221 = fVar221 + fVar221 * auVar90._8_4_;
  fVar222 = fVar222 + fVar222 * auVar90._12_4_;
  auVar90 = vrcpps_avx(auVar96);
  fVar173 = auVar90._0_4_;
  auVar175._0_4_ = fVar173 * auVar96._0_4_;
  fVar191 = auVar90._4_4_;
  auVar175._4_4_ = fVar191 * auVar96._4_4_;
  fVar192 = auVar90._8_4_;
  auVar175._8_4_ = fVar192 * auVar96._8_4_;
  fVar193 = auVar90._12_4_;
  auVar175._12_4_ = fVar193 * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar267,auVar175);
  fVar173 = fVar173 + fVar173 * auVar96._0_4_;
  fVar191 = fVar191 + fVar191 * auVar96._4_4_;
  fVar192 = fVar192 + fVar192 * auVar96._8_4_;
  fVar193 = fVar193 + fVar193 * auVar96._12_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar194);
  auVar149._0_4_ = fVar230 * auVar96._0_4_;
  auVar149._4_4_ = fVar243 * auVar96._4_4_;
  auVar149._8_4_ = fVar247 * auVar96._8_4_;
  auVar149._12_4_ = fVar251 * auVar96._12_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar90);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar194);
  auVar195._0_4_ = fVar230 * auVar96._0_4_;
  auVar195._4_4_ = fVar243 * auVar96._4_4_;
  auVar195._8_4_ = fVar247 * auVar96._8_4_;
  auVar195._12_4_ = fVar251 * auVar96._12_4_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar90 = vpmovsxwd_avx(auVar154);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar83 * -2 + 6);
  auVar96 = vpmovsxwd_avx(auVar155);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar116);
  auVar283._0_4_ = auVar96._0_4_ * fVar207;
  auVar283._4_4_ = auVar96._4_4_ * fVar220;
  auVar283._8_4_ = auVar96._8_4_ * fVar221;
  auVar283._12_4_ = auVar96._12_4_ * fVar222;
  auVar96 = vcvtdq2ps_avx(auVar90);
  auVar96 = vsubps_avx(auVar96,auVar116);
  auVar117._0_4_ = fVar207 * auVar96._0_4_;
  auVar117._4_4_ = fVar220 * auVar96._4_4_;
  auVar117._8_4_ = fVar221 * auVar96._8_4_;
  auVar117._12_4_ = fVar222 * auVar96._12_4_;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar82 + uVar83 + 6);
  auVar96 = vpmovsxwd_avx(auVar92);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar94);
  auVar209._0_4_ = auVar96._0_4_ * fVar173;
  auVar209._4_4_ = auVar96._4_4_ * fVar191;
  auVar209._8_4_ = auVar96._8_4_ * fVar192;
  auVar209._12_4_ = auVar96._12_4_ * fVar193;
  local_928 = prim;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar96 = vpmovsxwd_avx(auVar299);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar94);
  auVar85._0_4_ = auVar96._0_4_ * fVar173;
  auVar85._4_4_ = auVar96._4_4_ * fVar191;
  auVar85._8_4_ = auVar96._8_4_ * fVar192;
  auVar85._12_4_ = auVar96._12_4_ * fVar193;
  auVar96 = vpminsd_avx(auVar149,auVar195);
  auVar90 = vpminsd_avx(auVar283,auVar117);
  auVar96 = vmaxps_avx(auVar96,auVar90);
  auVar90 = vpminsd_avx(auVar209,auVar85);
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar298._4_4_ = uVar1;
  auVar298._0_4_ = uVar1;
  auVar298._8_4_ = uVar1;
  auVar298._12_4_ = uVar1;
  auVar90 = vmaxps_avx(auVar90,auVar298);
  auVar96 = vmaxps_avx(auVar96,auVar90);
  local_520._0_4_ = auVar96._0_4_ * 0.99999964;
  local_520._4_4_ = auVar96._4_4_ * 0.99999964;
  local_520._8_4_ = auVar96._8_4_ * 0.99999964;
  local_520._12_4_ = auVar96._12_4_ * 0.99999964;
  auVar96 = vpmaxsd_avx(auVar149,auVar195);
  auVar90 = vpmaxsd_avx(auVar283,auVar117);
  auVar96 = vminps_avx(auVar96,auVar90);
  auVar90 = vpmaxsd_avx(auVar209,auVar85);
  fVar207 = (ray->super_RayK<1>).tfar;
  auVar150._4_4_ = fVar207;
  auVar150._0_4_ = fVar207;
  auVar150._8_4_ = fVar207;
  auVar150._12_4_ = fVar207;
  auVar90 = vminps_avx(auVar90,auVar150);
  auVar96 = vminps_avx(auVar96,auVar90);
  auVar91._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar91._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar91._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar91._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar96 = vpshufd_avx(ZEXT116((byte)PVar5),0);
  auVar90 = vpcmpgtd_avx(auVar96,_DAT_01f7fcf0);
  auVar96 = vcmpps_avx(local_520,auVar91,2);
  auVar96 = vandps_avx(auVar96,auVar90);
  uVar79 = vmovmskps_avx(auVar96);
  if (uVar79 == 0) {
    return;
  }
  uVar79 = uVar79 & 0xff;
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_2e0 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
LAB_00e13cbc:
  uVar83 = (ulong)uVar79;
  lVar76 = 0;
  if (uVar83 != 0) {
    for (; (uVar79 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  uVar83 = uVar83 - 1 & uVar83;
  uVar79 = *(uint *)(local_928 + lVar76 * 4 + 6);
  lVar76 = lVar76 * 0x40;
  lVar10 = 0;
  if (uVar83 != 0) {
    for (; (uVar83 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  uVar6 = *(uint *)(local_928 + 2);
  auVar96 = *(undefined1 (*) [16])(prim + lVar76 + lVar67 + 0x16);
  if (((uVar83 != 0) && (uVar82 = uVar83 - 1 & uVar83, uVar82 != 0)) && (lVar10 = 0, uVar82 != 0)) {
    for (; (uVar82 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  auVar90 = *(undefined1 (*) [16])(prim + lVar76 + lVar67 + 0x26);
  auVar154 = *(undefined1 (*) [16])(prim + lVar76 + lVar67 + 0x36);
  auVar155 = *(undefined1 (*) [16])(prim + lVar76 + lVar67 + 0x46);
  auVar86._0_4_ = (auVar96._0_4_ + auVar90._0_4_ + auVar154._0_4_ + auVar155._0_4_) * 0.25;
  auVar86._4_4_ = (auVar96._4_4_ + auVar90._4_4_ + auVar154._4_4_ + auVar155._4_4_) * 0.25;
  auVar86._8_4_ = (auVar96._8_4_ + auVar90._8_4_ + auVar154._8_4_ + auVar155._8_4_) * 0.25;
  auVar86._12_4_ = (auVar96._12_4_ + auVar90._12_4_ + auVar154._12_4_ + auVar155._12_4_) * 0.25;
  aVar3 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar92 = vsubps_avx(auVar86,(undefined1  [16])aVar3);
  auVar92 = vdpps_avx(auVar92,(undefined1  [16])aVar4,0x7f);
  auVar299 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  auVar85 = vrcpss_avx(auVar299,auVar299);
  auVar301 = ZEXT464(0x40000000);
  fVar207 = auVar92._0_4_ * auVar85._0_4_ * (2.0 - auVar85._0_4_ * auVar299._0_4_);
  local_850 = ZEXT416((uint)fVar207);
  auVar299 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
  fVar207 = aVar4.x;
  fVar173 = aVar4.y;
  fVar220 = aVar4.z;
  aVar139 = aVar4.field_3;
  auVar233._0_4_ = aVar3.x + fVar207 * auVar299._0_4_;
  auVar233._4_4_ = aVar3.y + fVar173 * auVar299._4_4_;
  auVar233._8_4_ = aVar3.z + fVar220 * auVar299._8_4_;
  auVar233._12_4_ = aVar3.field_3.w + aVar139.w * auVar299._12_4_;
  auVar92 = vblendps_avx(auVar233,_DAT_01f7aa10,8);
  _local_970 = vsubps_avx(auVar96,auVar92);
  auVar270 = ZEXT1664(_local_970);
  _local_980 = vsubps_avx(auVar154,auVar92);
  _local_990 = vsubps_avx(auVar90,auVar92);
  _local_9a0 = vsubps_avx(auVar155,auVar92);
  auVar219 = ZEXT1664(_local_9a0);
  auVar96 = vshufps_avx(_local_970,_local_970,0);
  register0x00001290 = auVar96;
  _local_1e0 = auVar96;
  auVar96 = vshufps_avx(_local_970,_local_970,0x55);
  register0x00001290 = auVar96;
  _local_200 = auVar96;
  auVar96 = vshufps_avx(_local_970,_local_970,0xaa);
  register0x00001290 = auVar96;
  _local_220 = auVar96;
  auVar96 = vshufps_avx(_local_970,_local_970,0xff);
  register0x00001290 = auVar96;
  _local_240 = auVar96;
  auVar96 = vshufps_avx(_local_990,_local_990,0);
  register0x00001290 = auVar96;
  _local_260 = auVar96;
  auVar96 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar96;
  _local_280 = auVar96;
  auVar96 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar96;
  _local_2a0 = auVar96;
  auVar118._0_4_ = fVar207 * fVar207;
  auVar118._4_4_ = fVar173 * fVar173;
  auVar118._8_4_ = fVar220 * fVar220;
  auVar118._12_4_ = aVar139.w * aVar139.w;
  auVar96 = vshufps_avx(auVar118,auVar118,0xaa);
  auVar90 = vshufps_avx(auVar118,auVar118,0x55);
  auVar154 = vshufps_avx(_local_990,_local_990,0xff);
  register0x000012d0 = auVar154;
  _local_320 = auVar154;
  auVar154 = vshufps_avx(auVar118,auVar118,0);
  local_2c0._0_4_ = auVar154._0_4_ + auVar90._0_4_ + auVar96._0_4_;
  local_2c0._4_4_ = auVar154._4_4_ + auVar90._4_4_ + auVar96._4_4_;
  local_2c0._8_4_ = auVar154._8_4_ + auVar90._8_4_ + auVar96._8_4_;
  local_2c0._12_4_ = auVar154._12_4_ + auVar90._12_4_ + auVar96._12_4_;
  local_2c0._16_4_ = auVar154._0_4_ + auVar90._0_4_ + auVar96._0_4_;
  local_2c0._20_4_ = auVar154._4_4_ + auVar90._4_4_ + auVar96._4_4_;
  local_2c0._24_4_ = auVar154._8_4_ + auVar90._8_4_ + auVar96._8_4_;
  local_2c0._28_4_ = auVar154._12_4_ + auVar90._12_4_ + auVar96._12_4_;
  auVar242 = ZEXT3264(local_2c0);
  auVar96 = vshufps_avx(_local_980,_local_980,0);
  register0x00001250 = auVar96;
  _local_340 = auVar96;
  auVar96 = vshufps_avx(_local_980,_local_980,0x55);
  register0x00001250 = auVar96;
  _local_360 = auVar96;
  auVar96 = vshufps_avx(_local_980,_local_980,0xaa);
  register0x00001250 = auVar96;
  _local_380 = auVar96;
  auVar96 = vshufps_avx(_local_980,_local_980,0xff);
  register0x00001250 = auVar96;
  _local_3a0 = auVar96;
  auVar96 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001250 = auVar96;
  _local_3c0 = auVar96;
  auVar96 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001250 = auVar96;
  _local_3e0 = auVar96;
  auVar96 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar96;
  _local_400 = auVar96;
  auVar96 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar96;
  _local_420 = auVar96;
  register0x00001210 = auVar299;
  _local_720 = auVar299;
  local_aec = 1;
  uVar82 = 0;
  local_580 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  local_560 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_55c = local_560;
  fStack_558 = local_560;
  fStack_554 = local_560;
  fStack_550 = local_560;
  fStack_54c = local_560;
  fStack_548 = local_560;
  fStack_544 = local_560;
  local_7e0 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_7dc = local_7e0;
  fStack_7d8 = local_7e0;
  fStack_7d4 = local_7e0;
  fStack_7d0 = local_7e0;
  fStack_7cc = local_7e0;
  fStack_7c8 = local_7e0;
  fStack_7c4 = local_7e0;
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  local_440 = vandps_avx(local_2c0,auVar98);
  local_510 = ZEXT816(0x3f80000000000000);
  do {
    auVar358._8_4_ = 0x3f800000;
    auVar358._0_8_ = 0x3f8000003f800000;
    auVar358._12_4_ = 0x3f800000;
    auVar358._16_4_ = 0x3f800000;
    auVar358._20_4_ = 0x3f800000;
    iVar84 = (int)uVar82;
    auVar358._24_4_ = 0x3f800000;
    auVar358._28_4_ = 0x3f800000;
    auVar96 = vmovshdup_avx(local_510);
    auVar154 = vsubps_avx(auVar96,local_510);
    auVar96 = vshufps_avx(local_510,local_510,0);
    register0x00001290 = auVar96;
    _local_8e0 = auVar96;
    auVar90 = vshufps_avx(auVar154,auVar154,0);
    register0x00001250 = auVar90;
    _local_800 = auVar90;
    fVar114 = auVar90._0_4_;
    fVar135 = auVar90._4_4_;
    fVar137 = auVar90._8_4_;
    fVar140 = auVar90._12_4_;
    fVar146 = auVar96._0_4_;
    auVar187._0_4_ = fVar146 + fVar114 * 0.0;
    fVar170 = auVar96._4_4_;
    auVar187._4_4_ = fVar170 + fVar135 * 0.14285715;
    fVar171 = auVar96._8_4_;
    auVar187._8_4_ = fVar171 + fVar137 * 0.2857143;
    fVar172 = auVar96._12_4_;
    auVar187._12_4_ = fVar172 + fVar140 * 0.42857146;
    auVar187._16_4_ = fVar146 + fVar114 * 0.5714286;
    auVar187._20_4_ = fVar170 + fVar135 * 0.71428573;
    auVar187._24_4_ = fVar171 + fVar137 * 0.8571429;
    auVar187._28_4_ = fVar172 + fVar140;
    auVar97 = vsubps_avx(auVar358,auVar187);
    fVar173 = auVar97._0_4_;
    fVar220 = auVar97._4_4_;
    fVar191 = auVar97._8_4_;
    fVar221 = auVar97._12_4_;
    fVar192 = auVar97._16_4_;
    fVar222 = auVar97._20_4_;
    fVar193 = auVar97._24_4_;
    fVar251 = fVar173 * fVar173 * fVar173;
    fVar244 = fVar220 * fVar220 * fVar220;
    fVar248 = fVar191 * fVar191 * fVar191;
    fVar252 = fVar221 * fVar221 * fVar221;
    fVar255 = fVar192 * fVar192 * fVar192;
    fVar258 = fVar222 * fVar222 * fVar222;
    fVar261 = fVar193 * fVar193 * fVar193;
    fVar264 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
    fVar271 = auVar187._4_4_ * auVar187._4_4_ * auVar187._4_4_;
    fVar272 = auVar187._8_4_ * auVar187._8_4_ * auVar187._8_4_;
    fVar274 = auVar187._12_4_ * auVar187._12_4_ * auVar187._12_4_;
    fVar276 = auVar187._16_4_ * auVar187._16_4_ * auVar187._16_4_;
    fVar278 = auVar187._20_4_ * auVar187._20_4_ * auVar187._20_4_;
    fVar280 = auVar187._24_4_ * auVar187._24_4_ * auVar187._24_4_;
    fVar207 = auVar219._28_4_;
    fVar230 = auVar187._0_4_ * fVar173;
    fVar243 = auVar187._4_4_ * fVar220;
    fVar247 = auVar187._8_4_ * fVar191;
    fVar223 = auVar187._12_4_ * fVar221;
    fVar224 = auVar187._16_4_ * fVar192;
    fVar225 = auVar187._20_4_ * fVar222;
    fVar227 = auVar187._24_4_ * fVar193;
    fVar322 = auVar321._28_4_ + auVar338._28_4_;
    fVar295 = auVar270._28_4_ + fVar207 + fVar322;
    fVar314 = fVar322 + auVar242._28_4_ + auVar326._28_4_ + auVar301._28_4_;
    fVar322 = fVar251 * 0.16666667;
    fVar245 = fVar244 * 0.16666667;
    fVar249 = fVar248 * 0.16666667;
    fVar253 = fVar252 * 0.16666667;
    fVar256 = fVar255 * 0.16666667;
    fVar259 = fVar258 * 0.16666667;
    fVar262 = fVar261 * 0.16666667;
    fVar282 = (fVar264 + fVar251 * 4.0 + fVar173 * fVar230 * 12.0 + auVar187._0_4_ * fVar230 * 6.0)
              * 0.16666667;
    fVar289 = (fVar271 + fVar244 * 4.0 + fVar220 * fVar243 * 12.0 + auVar187._4_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar290 = (fVar272 + fVar248 * 4.0 + fVar191 * fVar247 * 12.0 + auVar187._8_4_ * fVar247 * 6.0)
              * 0.16666667;
    fVar291 = (fVar274 + fVar252 * 4.0 + fVar221 * fVar223 * 12.0 + auVar187._12_4_ * fVar223 * 6.0)
              * 0.16666667;
    fVar292 = (fVar276 + fVar255 * 4.0 + fVar192 * fVar224 * 12.0 + auVar187._16_4_ * fVar224 * 6.0)
              * 0.16666667;
    fVar293 = (fVar278 + fVar258 * 4.0 + fVar222 * fVar225 * 12.0 + auVar187._20_4_ * fVar225 * 6.0)
              * 0.16666667;
    fVar294 = (fVar280 + fVar261 * 4.0 + fVar193 * fVar227 * 12.0 + auVar187._24_4_ * fVar227 * 6.0)
              * 0.16666667;
    fVar251 = (fVar264 * 4.0 + fVar251 + auVar187._0_4_ * fVar230 * 12.0 + fVar173 * fVar230 * 6.0)
              * 0.16666667;
    fVar244 = (fVar271 * 4.0 + fVar244 + auVar187._4_4_ * fVar243 * 12.0 + fVar220 * fVar243 * 6.0)
              * 0.16666667;
    fVar248 = (fVar272 * 4.0 + fVar248 + auVar187._8_4_ * fVar247 * 12.0 + fVar191 * fVar247 * 6.0)
              * 0.16666667;
    fVar252 = (fVar274 * 4.0 + fVar252 + auVar187._12_4_ * fVar223 * 12.0 + fVar221 * fVar223 * 6.0)
              * 0.16666667;
    fVar255 = (fVar276 * 4.0 + fVar255 + auVar187._16_4_ * fVar224 * 12.0 + fVar192 * fVar224 * 6.0)
              * 0.16666667;
    fVar258 = (fVar278 * 4.0 + fVar258 + auVar187._20_4_ * fVar225 * 12.0 + fVar222 * fVar225 * 6.0)
              * 0.16666667;
    fVar261 = (fVar280 * 4.0 + fVar261 + auVar187._24_4_ * fVar227 * 12.0 + fVar193 * fVar227 * 6.0)
              * 0.16666667;
    fVar264 = fVar264 * 0.16666667;
    fVar271 = fVar271 * 0.16666667;
    fVar272 = fVar272 * 0.16666667;
    fVar274 = fVar274 * 0.16666667;
    fVar276 = fVar276 * 0.16666667;
    fVar278 = fVar278 * 0.16666667;
    fVar280 = fVar280 * 0.16666667;
    fVar333 = auVar326._28_4_ + 12.0;
    fVar315 = fVar314 + 12.166667;
    local_8c0 = (float)local_1e0._0_4_ * fVar322 +
                fVar282 * (float)local_260._0_4_ +
                fVar264 * (float)local_3c0._0_4_ + fVar251 * (float)local_340._0_4_;
    fStack_8bc = (float)local_1e0._4_4_ * fVar245 +
                 fVar289 * (float)local_260._4_4_ +
                 fVar271 * (float)local_3c0._4_4_ + fVar244 * (float)local_340._4_4_;
    fStack_8b8 = fStack_1d8 * fVar249 +
                 fVar290 * fStack_258 + fVar272 * fStack_3b8 + fVar248 * fStack_338;
    fStack_8b4 = fStack_1d4 * fVar253 +
                 fVar291 * fStack_254 + fVar274 * fStack_3b4 + fVar252 * fStack_334;
    fStack_8b0 = fStack_1d0 * fVar256 +
                 fVar292 * fStack_250 + fVar276 * fStack_3b0 + fVar255 * fStack_330;
    fStack_8ac = fStack_1cc * fVar259 +
                 fVar293 * fStack_24c + fVar278 * fStack_3ac + fVar258 * fStack_32c;
    fStack_8a8 = fStack_1c8 * fVar262 +
                 fVar294 * fStack_248 + fVar280 * fStack_3a8 + fVar261 * fStack_328;
    fStack_8a4 = fVar295 + fVar315;
    fVar115 = (float)local_200._0_4_ * fVar322 +
              (float)local_280._0_4_ * fVar282 +
              fVar264 * (float)local_3e0._0_4_ + fVar251 * (float)local_360._0_4_;
    fVar136 = (float)local_200._4_4_ * fVar245 +
              (float)local_280._4_4_ * fVar289 +
              fVar271 * (float)local_3e0._4_4_ + fVar244 * (float)local_360._4_4_;
    fVar138 = fStack_1f8 * fVar249 +
              fStack_278 * fVar290 + fVar272 * fStack_3d8 + fVar248 * fStack_358;
    fVar141 = fStack_1f4 * fVar253 +
              fStack_274 * fVar291 + fVar274 * fStack_3d4 + fVar252 * fStack_354;
    fVar142 = fStack_1f0 * fVar256 +
              fStack_270 * fVar292 + fVar276 * fStack_3d0 + fVar255 * fStack_350;
    fVar143 = fStack_1ec * fVar259 +
              fStack_26c * fVar293 + fVar278 * fStack_3cc + fVar258 * fStack_34c;
    fVar144 = fStack_1e8 * fVar262 +
              fStack_268 * fVar294 + fVar280 * fStack_3c8 + fVar261 * fStack_348;
    fVar145 = fVar295 + fVar333 + 12.166667;
    local_8a0 = (float)local_220._0_4_ * fVar322 +
                (float)local_2a0._0_4_ * fVar282 +
                fVar264 * (float)local_400._0_4_ + fVar251 * (float)local_380._0_4_;
    fStack_89c = (float)local_220._4_4_ * fVar245 +
                 (float)local_2a0._4_4_ * fVar289 +
                 fVar271 * (float)local_400._4_4_ + fVar244 * (float)local_380._4_4_;
    fStack_898 = fStack_218 * fVar249 +
                 fStack_298 * fVar290 + fVar272 * fStack_3f8 + fVar248 * fStack_378;
    aStack_894.w = fStack_214 * fVar253 +
                   fStack_294 * fVar291 + fVar274 * fStack_3f4 + fVar252 * fStack_374;
    fStack_890 = fStack_210 * fVar256 +
                 fStack_290 * fVar292 + fVar276 * fStack_3f0 + fVar255 * fStack_370;
    fStack_88c = fStack_20c * fVar259 +
                 fStack_28c * fVar293 + fVar278 * fStack_3ec + fVar258 * fStack_36c;
    fStack_888 = fStack_208 * fVar262 +
                 fStack_288 * fVar294 + fVar280 * fStack_3e8 + fVar261 * fStack_368;
    fStack_884 = fVar295 + fVar333 + auVar338._28_4_ + 12.0;
    local_aa0._0_4_ =
         (float)local_240._0_4_ * fVar322 +
         fVar282 * (float)local_320._0_4_ +
         fVar251 * (float)local_3a0._0_4_ + fVar264 * (float)local_420._0_4_;
    local_aa0._4_4_ =
         (float)local_240._4_4_ * fVar245 +
         fVar289 * (float)local_320._4_4_ +
         fVar244 * (float)local_3a0._4_4_ + fVar271 * (float)local_420._4_4_;
    fStack_a98 = fStack_238 * fVar249 +
                 fVar290 * fStack_318 + fVar248 * fStack_398 + fVar272 * fStack_418;
    fStack_a94 = fStack_234 * fVar253 +
                 fVar291 * fStack_314 + fVar252 * fStack_394 + fVar274 * fStack_414;
    fStack_a90 = fStack_230 * fVar256 +
                 fVar292 * fStack_310 + fVar255 * fStack_390 + fVar276 * fStack_410;
    fStack_a8c = fStack_22c * fVar259 +
                 fVar293 * fStack_30c + fVar258 * fStack_38c + fVar278 * fStack_40c;
    fStack_a88 = fStack_228 * fVar262 +
                 fVar294 * fStack_308 + fVar261 * fStack_388 + fVar280 * fStack_408;
    fStack_a84 = auVar242._28_4_ + fVar295 + fVar314 + auVar270._28_4_;
    auVar19._4_4_ = auVar187._4_4_ * -auVar187._4_4_;
    auVar19._0_4_ = auVar187._0_4_ * -auVar187._0_4_;
    auVar19._8_4_ = auVar187._8_4_ * -auVar187._8_4_;
    auVar19._12_4_ = auVar187._12_4_ * -auVar187._12_4_;
    auVar19._16_4_ = auVar187._16_4_ * -auVar187._16_4_;
    auVar19._20_4_ = auVar187._20_4_ * -auVar187._20_4_;
    auVar19._24_4_ = auVar187._24_4_ * -auVar187._24_4_;
    auVar19._28_4_ = auVar187._28_4_;
    auVar20._4_4_ = fVar243 * 4.0;
    auVar20._0_4_ = fVar230 * 4.0;
    auVar20._8_4_ = fVar247 * 4.0;
    auVar20._12_4_ = fVar223 * 4.0;
    auVar20._16_4_ = fVar224 * 4.0;
    auVar20._20_4_ = fVar225 * 4.0;
    auVar20._24_4_ = fVar227 * 4.0;
    auVar20._28_4_ = fVar207;
    auVar97 = vsubps_avx(auVar19,auVar20);
    fVar261 = fVar173 * -fVar173 * 0.5;
    fVar262 = fVar220 * -fVar220 * 0.5;
    fVar264 = fVar191 * -fVar191 * 0.5;
    fVar271 = fVar221 * -fVar221 * 0.5;
    fVar272 = fVar192 * -fVar192 * 0.5;
    fVar274 = fVar222 * -fVar222 * 0.5;
    fVar276 = fVar193 * -fVar193 * 0.5;
    fVar244 = auVar97._0_4_ * 0.5;
    fVar245 = auVar97._4_4_ * 0.5;
    fVar252 = auVar97._8_4_ * 0.5;
    fVar255 = auVar97._12_4_ * 0.5;
    fVar256 = auVar97._16_4_ * 0.5;
    fVar258 = auVar97._20_4_ * 0.5;
    fVar259 = auVar97._24_4_ * 0.5;
    fVar251 = (fVar173 * fVar173 + fVar230 * 4.0) * 0.5;
    fVar322 = (fVar220 * fVar220 + fVar243 * 4.0) * 0.5;
    fVar248 = (fVar191 * fVar191 + fVar247 * 4.0) * 0.5;
    fVar249 = (fVar221 * fVar221 + fVar223 * 4.0) * 0.5;
    fVar224 = (fVar192 * fVar192 + fVar224 * 4.0) * 0.5;
    fVar225 = (fVar222 * fVar222 + fVar225 * 4.0) * 0.5;
    fVar227 = (fVar193 * fVar193 + fVar227 * 4.0) * 0.5;
    fVar173 = auVar187._0_4_ * auVar187._0_4_ * 0.5;
    fVar220 = auVar187._4_4_ * auVar187._4_4_ * 0.5;
    fVar191 = auVar187._8_4_ * auVar187._8_4_ * 0.5;
    fVar221 = auVar187._12_4_ * auVar187._12_4_ * 0.5;
    fVar230 = auVar187._16_4_ * auVar187._16_4_ * 0.5;
    fVar243 = auVar187._20_4_ * auVar187._20_4_ * 0.5;
    fVar247 = auVar187._24_4_ * auVar187._24_4_ * 0.5;
    fVar253 = auVar97._28_4_ + fVar172 + fVar207 + fVar315 + fVar207;
    auVar96 = vpermilps_avx(ZEXT416((uint)(auVar154._0_4_ * 0.04761905)),0);
    fVar192 = auVar96._0_4_;
    fVar334 = fVar192 * ((float)local_1e0._0_4_ * fVar261 +
                        (float)local_260._0_4_ * fVar244 +
                        fVar251 * (float)local_340._0_4_ + fVar173 * (float)local_3c0._0_4_);
    fVar222 = auVar96._4_4_;
    fVar339 = fVar222 * ((float)local_1e0._4_4_ * fVar262 +
                        (float)local_260._4_4_ * fVar245 +
                        fVar322 * (float)local_340._4_4_ + fVar220 * (float)local_3c0._4_4_);
    local_9e0._4_4_ = fVar339;
    local_9e0._0_4_ = fVar334;
    fVar193 = auVar96._8_4_;
    fVar340 = fVar193 * (fStack_1d8 * fVar264 +
                        fStack_258 * fVar252 + fVar248 * fStack_338 + fVar191 * fStack_3b8);
    local_9e0._8_4_ = fVar340;
    fVar223 = auVar96._12_4_;
    fVar341 = fVar223 * (fStack_1d4 * fVar271 +
                        fStack_254 * fVar255 + fVar249 * fStack_334 + fVar221 * fStack_3b4);
    local_9e0._12_4_ = fVar341;
    fVar342 = fVar192 * (fStack_1d0 * fVar272 +
                        fStack_250 * fVar256 + fVar224 * fStack_330 + fVar230 * fStack_3b0);
    local_9e0._16_4_ = fVar342;
    fVar343 = fVar222 * (fStack_1cc * fVar274 +
                        fStack_24c * fVar258 + fVar225 * fStack_32c + fVar243 * fStack_3ac);
    local_9e0._20_4_ = fVar343;
    fVar344 = fVar193 * (fStack_1c8 * fVar276 +
                        fStack_248 * fVar259 + fVar227 * fStack_328 + fVar247 * fStack_3a8);
    local_9e0._24_4_ = fVar344;
    local_9e0._28_4_ = uStack_1c4;
    fVar323 = fVar192 * ((float)local_200._0_4_ * fVar261 +
                        (float)local_280._0_4_ * fVar244 +
                        fVar251 * (float)local_360._0_4_ + fVar173 * (float)local_3e0._0_4_);
    fVar327 = fVar222 * ((float)local_200._4_4_ * fVar262 +
                        (float)local_280._4_4_ * fVar245 +
                        fVar322 * (float)local_360._4_4_ + fVar220 * (float)local_3e0._4_4_);
    local_a00._4_4_ = fVar327;
    local_a00._0_4_ = fVar323;
    fVar328 = fVar193 * (fStack_1f8 * fVar264 +
                        fStack_278 * fVar252 + fVar248 * fStack_358 + fVar191 * fStack_3d8);
    local_a00._8_4_ = fVar328;
    fVar329 = fVar223 * (fStack_1f4 * fVar271 +
                        fStack_274 * fVar255 + fVar249 * fStack_354 + fVar221 * fStack_3d4);
    local_a00._12_4_ = fVar329;
    fVar330 = fVar192 * (fStack_1f0 * fVar272 +
                        fStack_270 * fVar256 + fVar224 * fStack_350 + fVar230 * fStack_3d0);
    local_a00._16_4_ = fVar330;
    fVar331 = fVar222 * (fStack_1ec * fVar274 +
                        fStack_26c * fVar258 + fVar225 * fStack_34c + fVar243 * fStack_3cc);
    local_a00._20_4_ = fVar331;
    fVar332 = fVar193 * (fStack_1e8 * fVar276 +
                        fStack_268 * fVar259 + fVar227 * fStack_348 + fVar247 * fStack_3c8);
    local_a00._24_4_ = fVar332;
    local_a00._28_4_ = uStack_224;
    fVar296 = fVar192 * ((float)local_220._0_4_ * fVar261 +
                        fVar173 * (float)local_400._0_4_ + fVar251 * (float)local_380._0_4_ +
                        (float)local_2a0._0_4_ * fVar244);
    fVar302 = fVar222 * ((float)local_220._4_4_ * fVar262 +
                        fVar220 * (float)local_400._4_4_ + fVar322 * (float)local_380._4_4_ +
                        (float)local_2a0._4_4_ * fVar245);
    local_a20._4_4_ = fVar302;
    local_a20._0_4_ = fVar296;
    fVar304 = fVar193 * (fStack_218 * fVar264 +
                        fVar191 * fStack_3f8 + fVar248 * fStack_378 + fStack_298 * fVar252);
    local_a20._8_4_ = fVar304;
    fVar306 = fVar223 * (fStack_214 * fVar271 +
                        fVar221 * fStack_3f4 + fVar249 * fStack_374 + fStack_294 * fVar255);
    local_a20._12_4_ = fVar306;
    fVar308 = fVar192 * (fStack_210 * fVar272 +
                        fVar230 * fStack_3f0 + fVar224 * fStack_370 + fStack_290 * fVar256);
    local_a20._16_4_ = fVar308;
    fVar310 = fVar222 * (fStack_20c * fVar274 +
                        fVar243 * fStack_3ec + fVar225 * fStack_36c + fStack_28c * fVar258);
    local_a20._20_4_ = fVar310;
    fVar312 = fVar193 * (fStack_208 * fVar276 +
                        fVar247 * fStack_3e8 + fVar227 * fStack_368 + fStack_288 * fVar259);
    local_a20._24_4_ = fVar312;
    local_a20._28_4_ = fVar315;
    fVar244 = fVar192 * ((float)local_240._0_4_ * fVar261 +
                        fVar244 * (float)local_320._0_4_ +
                        fVar173 * (float)local_420._0_4_ + fVar251 * (float)local_3a0._0_4_);
    fVar245 = fVar222 * ((float)local_240._4_4_ * fVar262 +
                        fVar245 * (float)local_320._4_4_ +
                        fVar220 * (float)local_420._4_4_ + fVar322 * (float)local_3a0._4_4_);
    auVar21._4_4_ = fVar245;
    auVar21._0_4_ = fVar244;
    fVar252 = fVar193 * (fStack_238 * fVar264 +
                        fVar252 * fStack_318 + fVar191 * fStack_418 + fVar248 * fStack_398);
    auVar21._8_4_ = fVar252;
    fVar223 = fVar223 * (fStack_234 * fVar271 +
                        fVar255 * fStack_314 + fVar221 * fStack_414 + fVar249 * fStack_394);
    auVar21._12_4_ = fVar223;
    fVar192 = fVar192 * (fStack_230 * fVar272 +
                        fVar256 * fStack_310 + fVar230 * fStack_410 + fVar224 * fStack_390);
    auVar21._16_4_ = fVar192;
    fVar222 = fVar222 * (fStack_22c * fVar274 +
                        fVar258 * fStack_30c + fVar243 * fStack_40c + fVar225 * fStack_38c);
    auVar21._20_4_ = fVar222;
    fVar193 = fVar193 * (fStack_228 * fVar276 +
                        fVar259 * fStack_308 + fVar247 * fStack_408 + fVar227 * fStack_388);
    auVar21._24_4_ = fVar193;
    auVar21._28_4_ = fVar253;
    auVar68._4_4_ = fVar136;
    auVar68._0_4_ = fVar115;
    auVar68._8_4_ = fVar138;
    auVar68._12_4_ = fVar141;
    auVar68._16_4_ = fVar142;
    auVar68._20_4_ = fVar143;
    auVar68._24_4_ = fVar144;
    auVar68._28_4_ = fVar145;
    auVar97 = vperm2f128_avx(auVar68,auVar68,1);
    auVar97 = vshufps_avx(auVar97,auVar68,0x30);
    local_880 = vshufps_avx(auVar68,auVar97,0x29);
    auVar73._4_4_ = fStack_89c;
    auVar73._0_4_ = local_8a0;
    auVar73._8_4_ = fStack_898;
    auVar73._12_4_ = aStack_894;
    auVar73._16_4_ = fStack_890;
    auVar73._20_4_ = fStack_88c;
    auVar73._24_4_ = fStack_888;
    auVar73._28_4_ = fStack_884;
    auVar97 = vperm2f128_avx(auVar73,auVar73,1);
    auVar97 = vshufps_avx(auVar97,auVar73,0x30);
    local_9c0 = vshufps_avx(auVar73,auVar97,0x29);
    auVar98 = vsubps_avx(_local_aa0,auVar21);
    auVar97 = vperm2f128_avx(auVar98,auVar98,1);
    auVar97 = vshufps_avx(auVar97,auVar98,0x30);
    _local_820 = vshufps_avx(auVar98,auVar97,0x29);
    _local_5c0 = vsubps_avx(local_880,auVar68);
    local_6e0 = vsubps_avx(local_9c0,auVar73);
    fVar173 = local_5c0._0_4_;
    fVar243 = local_5c0._4_4_;
    auVar288._4_4_ = fVar302 * fVar243;
    auVar288._0_4_ = fVar296 * fVar173;
    fVar249 = local_5c0._8_4_;
    auVar288._8_4_ = fVar304 * fVar249;
    fVar258 = local_5c0._12_4_;
    auVar288._12_4_ = fVar306 * fVar258;
    fVar276 = local_5c0._16_4_;
    auVar288._16_4_ = fVar308 * fVar276;
    fVar293 = local_5c0._20_4_;
    auVar288._20_4_ = fVar310 * fVar293;
    fVar12 = local_5c0._24_4_;
    auVar288._24_4_ = fVar312 * fVar12;
    auVar288._28_4_ = auVar98._28_4_;
    fVar220 = local_6e0._0_4_;
    fVar247 = local_6e0._4_4_;
    auVar160._4_4_ = fVar327 * fVar247;
    auVar160._0_4_ = fVar323 * fVar220;
    fVar224 = local_6e0._8_4_;
    auVar160._8_4_ = fVar328 * fVar224;
    fVar259 = local_6e0._12_4_;
    auVar160._12_4_ = fVar329 * fVar259;
    fVar278 = local_6e0._16_4_;
    auVar160._16_4_ = fVar330 * fVar278;
    fVar294 = local_6e0._20_4_;
    auVar160._20_4_ = fVar331 * fVar294;
    fVar13 = local_6e0._24_4_;
    auVar160._24_4_ = fVar332 * fVar13;
    auVar160._28_4_ = auVar97._28_4_;
    auVar19 = vsubps_avx(auVar160,auVar288);
    auVar70._4_4_ = fStack_8bc;
    auVar70._0_4_ = local_8c0;
    auVar70._8_4_ = fStack_8b8;
    auVar70._12_4_ = fStack_8b4;
    auVar70._16_4_ = fStack_8b0;
    auVar70._20_4_ = fStack_8ac;
    auVar70._24_4_ = fStack_8a8;
    auVar70._28_4_ = fStack_8a4;
    auVar97 = vperm2f128_avx(auVar70,auVar70,1);
    auVar97 = vshufps_avx(auVar97,auVar70,0x30);
    local_740 = vshufps_avx(auVar70,auVar97,0x29);
    local_5e0 = vsubps_avx(local_740,auVar70);
    auVar22._4_4_ = fVar339 * fVar247;
    auVar22._0_4_ = fVar334 * fVar220;
    auVar22._8_4_ = fVar340 * fVar224;
    auVar22._12_4_ = fVar341 * fVar259;
    auVar22._16_4_ = fVar342 * fVar278;
    auVar22._20_4_ = fVar343 * fVar294;
    auVar22._24_4_ = fVar344 * fVar13;
    auVar22._28_4_ = local_740._28_4_;
    fVar191 = local_5e0._0_4_;
    fVar251 = local_5e0._4_4_;
    auVar23._4_4_ = fVar302 * fVar251;
    auVar23._0_4_ = fVar296 * fVar191;
    fVar225 = local_5e0._8_4_;
    auVar23._8_4_ = fVar304 * fVar225;
    fVar261 = local_5e0._12_4_;
    auVar23._12_4_ = fVar306 * fVar261;
    fVar280 = local_5e0._16_4_;
    auVar23._16_4_ = fVar308 * fVar280;
    fVar295 = local_5e0._20_4_;
    auVar23._20_4_ = fVar310 * fVar295;
    fVar14 = local_5e0._24_4_;
    auVar23._24_4_ = fVar312 * fVar14;
    auVar23._28_4_ = local_880._28_4_;
    auVar20 = vsubps_avx(auVar23,auVar22);
    auVar269._4_4_ = fVar327 * fVar251;
    auVar269._0_4_ = fVar323 * fVar191;
    auVar269._8_4_ = fVar328 * fVar225;
    auVar269._12_4_ = fVar329 * fVar261;
    auVar269._16_4_ = fVar330 * fVar280;
    auVar269._20_4_ = fVar331 * fVar295;
    auVar269._24_4_ = fVar332 * fVar14;
    auVar269._28_4_ = local_880._28_4_;
    auVar24._4_4_ = fVar339 * fVar243;
    auVar24._0_4_ = fVar334 * fVar173;
    auVar24._8_4_ = fVar340 * fVar249;
    auVar24._12_4_ = fVar341 * fVar258;
    auVar24._16_4_ = fVar342 * fVar276;
    auVar24._20_4_ = fVar343 * fVar293;
    auVar24._24_4_ = fVar344 * fVar12;
    auVar24._28_4_ = uStack_204;
    auVar21 = vsubps_avx(auVar24,auVar269);
    fVar207 = auVar21._28_4_;
    auVar127._0_4_ = fVar191 * fVar191 + fVar173 * fVar173 + fVar220 * fVar220;
    auVar127._4_4_ = fVar251 * fVar251 + fVar243 * fVar243 + fVar247 * fVar247;
    auVar127._8_4_ = fVar225 * fVar225 + fVar249 * fVar249 + fVar224 * fVar224;
    auVar127._12_4_ = fVar261 * fVar261 + fVar258 * fVar258 + fVar259 * fVar259;
    auVar127._16_4_ = fVar280 * fVar280 + fVar276 * fVar276 + fVar278 * fVar278;
    auVar127._20_4_ = fVar295 * fVar295 + fVar293 * fVar293 + fVar294 * fVar294;
    auVar127._24_4_ = fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13;
    auVar127._28_4_ = fVar207 + fVar207 + auVar19._28_4_;
    auVar97 = vrcpps_avx(auVar127);
    fVar255 = auVar97._0_4_;
    fVar256 = auVar97._4_4_;
    auVar25._4_4_ = fVar256 * auVar127._4_4_;
    auVar25._0_4_ = fVar255 * auVar127._0_4_;
    fVar264 = auVar97._8_4_;
    auVar25._8_4_ = fVar264 * auVar127._8_4_;
    fVar271 = auVar97._12_4_;
    auVar25._12_4_ = fVar271 * auVar127._12_4_;
    fVar272 = auVar97._16_4_;
    auVar25._16_4_ = fVar272 * auVar127._16_4_;
    fVar274 = auVar97._20_4_;
    auVar25._20_4_ = fVar274 * auVar127._20_4_;
    fVar289 = auVar97._24_4_;
    auVar25._24_4_ = fVar289 * auVar127._24_4_;
    auVar25._28_4_ = uStack_204;
    auVar99._8_4_ = 0x3f800000;
    auVar99._0_8_ = 0x3f8000003f800000;
    auVar99._12_4_ = 0x3f800000;
    auVar99._16_4_ = 0x3f800000;
    auVar99._20_4_ = 0x3f800000;
    auVar99._24_4_ = 0x3f800000;
    auVar99._28_4_ = 0x3f800000;
    auVar288 = vsubps_avx(auVar99,auVar25);
    fVar255 = auVar288._0_4_ * fVar255 + fVar255;
    fVar256 = auVar288._4_4_ * fVar256 + fVar256;
    fVar264 = auVar288._8_4_ * fVar264 + fVar264;
    fVar271 = auVar288._12_4_ * fVar271 + fVar271;
    fVar272 = auVar288._16_4_ * fVar272 + fVar272;
    fVar274 = auVar288._20_4_ * fVar274 + fVar274;
    fVar289 = auVar288._24_4_ * fVar289 + fVar289;
    auVar98 = vperm2f128_avx(local_a00,local_a00,1);
    auVar98 = vshufps_avx(auVar98,local_a00,0x30);
    local_900 = vshufps_avx(local_a00,auVar98,0x29);
    auVar98 = vperm2f128_avx(local_a20,local_a20,1);
    auVar98 = vshufps_avx(auVar98,local_a20,0x30);
    local_780 = vshufps_avx(local_a20,auVar98,0x29);
    fVar221 = local_780._0_4_;
    fVar322 = local_780._4_4_;
    auVar26._4_4_ = fVar243 * fVar322;
    auVar26._0_4_ = fVar173 * fVar221;
    fVar227 = local_780._8_4_;
    auVar26._8_4_ = fVar249 * fVar227;
    fVar262 = local_780._12_4_;
    auVar26._12_4_ = fVar258 * fVar262;
    fVar282 = local_780._16_4_;
    auVar26._16_4_ = fVar276 * fVar282;
    fVar314 = local_780._20_4_;
    auVar26._20_4_ = fVar293 * fVar314;
    fVar15 = local_780._24_4_;
    auVar26._24_4_ = fVar12 * fVar15;
    auVar26._28_4_ = auVar98._28_4_;
    fVar345 = local_900._0_4_;
    fVar352 = local_900._4_4_;
    auVar27._4_4_ = fVar352 * fVar247;
    auVar27._0_4_ = fVar345 * fVar220;
    fVar353 = local_900._8_4_;
    auVar27._8_4_ = fVar353 * fVar224;
    fVar354 = local_900._12_4_;
    auVar27._12_4_ = fVar354 * fVar259;
    fVar355 = local_900._16_4_;
    auVar27._16_4_ = fVar355 * fVar278;
    fVar356 = local_900._20_4_;
    auVar27._20_4_ = fVar356 * fVar294;
    fVar357 = local_900._24_4_;
    auVar27._24_4_ = fVar357 * fVar13;
    auVar27._28_4_ = uStack_224;
    auVar160 = vsubps_avx(auVar27,auVar26);
    auVar98 = vperm2f128_avx(local_9e0,local_9e0,1);
    auVar98 = vshufps_avx(auVar98,local_9e0,0x30);
    local_760 = vshufps_avx(local_9e0,auVar98,0x29);
    fVar297 = local_760._0_4_;
    fVar303 = local_760._4_4_;
    auVar28._4_4_ = fVar303 * fVar247;
    auVar28._0_4_ = fVar297 * fVar220;
    fVar305 = local_760._8_4_;
    auVar28._8_4_ = fVar305 * fVar224;
    fVar307 = local_760._12_4_;
    auVar28._12_4_ = fVar307 * fVar259;
    fVar309 = local_760._16_4_;
    auVar28._16_4_ = fVar309 * fVar278;
    fVar311 = local_760._20_4_;
    auVar28._20_4_ = fVar311 * fVar294;
    fVar313 = local_760._24_4_;
    auVar28._24_4_ = fVar313 * fVar13;
    auVar28._28_4_ = auVar98._28_4_;
    auVar23 = local_780;
    auVar29._4_4_ = fVar322 * fVar251;
    auVar29._0_4_ = fVar221 * fVar191;
    auVar29._8_4_ = fVar227 * fVar225;
    auVar29._12_4_ = fVar262 * fVar261;
    auVar29._16_4_ = fVar282 * fVar280;
    auVar29._20_4_ = fVar314 * fVar295;
    auVar29._24_4_ = fVar15 * fVar14;
    auVar29._28_4_ = uStack_1c4;
    auVar22 = vsubps_avx(auVar29,auVar28);
    auVar30._4_4_ = fVar352 * fVar251;
    auVar30._0_4_ = fVar345 * fVar191;
    auVar30._8_4_ = fVar353 * fVar225;
    auVar30._12_4_ = fVar354 * fVar261;
    auVar30._16_4_ = fVar355 * fVar280;
    auVar30._20_4_ = fVar356 * fVar295;
    auVar30._24_4_ = fVar357 * fVar14;
    auVar30._28_4_ = uStack_1c4;
    auVar31._4_4_ = fVar303 * fVar243;
    auVar31._0_4_ = fVar297 * fVar173;
    auVar31._8_4_ = fVar305 * fVar249;
    auVar31._12_4_ = fVar307 * fVar258;
    auVar31._16_4_ = fVar309 * fVar276;
    auVar31._20_4_ = fVar311 * fVar293;
    fVar230 = local_900._28_4_;
    auVar31._24_4_ = fVar313 * fVar12;
    auVar31._28_4_ = fVar230;
    auVar98 = vsubps_avx(auVar31,auVar30);
    fVar248 = auVar98._28_4_;
    auVar32._4_4_ =
         (auVar19._4_4_ * auVar19._4_4_ +
         auVar20._4_4_ * auVar20._4_4_ + auVar21._4_4_ * auVar21._4_4_) * fVar256;
    auVar32._0_4_ =
         (auVar19._0_4_ * auVar19._0_4_ +
         auVar20._0_4_ * auVar20._0_4_ + auVar21._0_4_ * auVar21._0_4_) * fVar255;
    auVar32._8_4_ =
         (auVar19._8_4_ * auVar19._8_4_ +
         auVar20._8_4_ * auVar20._8_4_ + auVar21._8_4_ * auVar21._8_4_) * fVar264;
    auVar32._12_4_ =
         (auVar19._12_4_ * auVar19._12_4_ +
         auVar20._12_4_ * auVar20._12_4_ + auVar21._12_4_ * auVar21._12_4_) * fVar271;
    auVar32._16_4_ =
         (auVar19._16_4_ * auVar19._16_4_ +
         auVar20._16_4_ * auVar20._16_4_ + auVar21._16_4_ * auVar21._16_4_) * fVar272;
    auVar32._20_4_ =
         (auVar19._20_4_ * auVar19._20_4_ +
         auVar20._20_4_ * auVar20._20_4_ + auVar21._20_4_ * auVar21._20_4_) * fVar274;
    auVar32._24_4_ =
         (auVar19._24_4_ * auVar19._24_4_ +
         auVar20._24_4_ * auVar20._24_4_ + auVar21._24_4_ * auVar21._24_4_) * fVar289;
    auVar32._28_4_ = auVar19._28_4_ + auVar20._28_4_ + fVar207;
    auVar33._4_4_ =
         (auVar160._4_4_ * auVar160._4_4_ +
         auVar22._4_4_ * auVar22._4_4_ + auVar98._4_4_ * auVar98._4_4_) * fVar256;
    auVar33._0_4_ =
         (auVar160._0_4_ * auVar160._0_4_ +
         auVar22._0_4_ * auVar22._0_4_ + auVar98._0_4_ * auVar98._0_4_) * fVar255;
    auVar33._8_4_ =
         (auVar160._8_4_ * auVar160._8_4_ +
         auVar22._8_4_ * auVar22._8_4_ + auVar98._8_4_ * auVar98._8_4_) * fVar264;
    auVar33._12_4_ =
         (auVar160._12_4_ * auVar160._12_4_ +
         auVar22._12_4_ * auVar22._12_4_ + auVar98._12_4_ * auVar98._12_4_) * fVar271;
    auVar33._16_4_ =
         (auVar160._16_4_ * auVar160._16_4_ +
         auVar22._16_4_ * auVar22._16_4_ + auVar98._16_4_ * auVar98._16_4_) * fVar272;
    auVar33._20_4_ =
         (auVar160._20_4_ * auVar160._20_4_ +
         auVar22._20_4_ * auVar22._20_4_ + auVar98._20_4_ * auVar98._20_4_) * fVar274;
    auVar33._24_4_ =
         (auVar160._24_4_ * auVar160._24_4_ +
         auVar22._24_4_ * auVar22._24_4_ + auVar98._24_4_ * auVar98._24_4_) * fVar289;
    auVar33._28_4_ = auVar288._28_4_ + auVar97._28_4_;
    auVar97 = vmaxps_avx(auVar32,auVar33);
    auVar98 = vperm2f128_avx(_local_aa0,_local_aa0,1);
    auVar98 = vshufps_avx(auVar98,_local_aa0,0x30);
    _local_840 = vshufps_avx(_local_aa0,auVar98,0x29);
    local_680._0_4_ = (float)local_aa0._0_4_ + fVar244;
    local_680._4_4_ = (float)local_aa0._4_4_ + fVar245;
    fStack_678 = fStack_a98 + fVar252;
    fStack_674 = fStack_a94 + fVar223;
    fStack_670 = fStack_a90 + fVar192;
    fStack_66c = fStack_a8c + fVar222;
    fStack_668 = fStack_a88 + fVar193;
    register0x0000121c = fStack_a84 + fVar253;
    auVar98 = vmaxps_avx(_local_aa0,_local_680);
    auVar19 = vmaxps_avx(_local_820,_local_840);
    auVar98 = vmaxps_avx(auVar98,auVar19);
    auVar19 = vrsqrtps_avx(auVar127);
    fVar207 = auVar19._0_4_;
    fVar192 = auVar19._4_4_;
    fVar222 = auVar19._8_4_;
    fVar193 = auVar19._12_4_;
    fVar223 = auVar19._16_4_;
    fVar244 = auVar19._20_4_;
    fVar245 = auVar19._24_4_;
    auVar34._4_4_ = fVar192 * fVar192 * fVar192 * auVar127._4_4_ * 0.5;
    auVar34._0_4_ = fVar207 * fVar207 * fVar207 * auVar127._0_4_ * 0.5;
    auVar34._8_4_ = fVar222 * fVar222 * fVar222 * auVar127._8_4_ * 0.5;
    auVar34._12_4_ = fVar193 * fVar193 * fVar193 * auVar127._12_4_ * 0.5;
    auVar34._16_4_ = fVar223 * fVar223 * fVar223 * auVar127._16_4_ * 0.5;
    auVar34._20_4_ = fVar244 * fVar244 * fVar244 * auVar127._20_4_ * 0.5;
    auVar34._24_4_ = fVar245 * fVar245 * fVar245 * auVar127._24_4_ * 0.5;
    auVar34._28_4_ = auVar127._28_4_;
    auVar35._4_4_ = fVar192 * 1.5;
    auVar35._0_4_ = fVar207 * 1.5;
    auVar35._8_4_ = fVar222 * 1.5;
    auVar35._12_4_ = fVar193 * 1.5;
    auVar35._16_4_ = fVar223 * 1.5;
    auVar35._20_4_ = fVar244 * 1.5;
    auVar35._24_4_ = fVar245 * 1.5;
    auVar35._28_4_ = auVar19._28_4_;
    local_460 = vsubps_avx(auVar35,auVar34);
    auVar69._4_4_ = fVar136;
    auVar69._0_4_ = fVar115;
    auVar69._8_4_ = fVar138;
    auVar69._12_4_ = fVar141;
    auVar69._16_4_ = fVar142;
    auVar69._20_4_ = fVar143;
    auVar69._24_4_ = fVar144;
    auVar69._28_4_ = fVar145;
    local_7a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar69);
    local_7c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar73);
    fVar192 = local_7c0._0_4_;
    fVar223 = local_7c0._4_4_;
    fVar252 = local_7c0._8_4_;
    fVar264 = local_7c0._12_4_;
    fVar289 = local_7c0._16_4_;
    fVar315 = local_7c0._20_4_;
    fVar16 = local_7c0._24_4_;
    fVar222 = local_7a0._0_4_;
    fVar244 = local_7a0._4_4_;
    fVar253 = local_7a0._8_4_;
    fVar271 = local_7a0._12_4_;
    fVar290 = local_7a0._16_4_;
    fVar333 = local_7a0._20_4_;
    fVar17 = local_7a0._24_4_;
    auVar20 = vsubps_avx(ZEXT832(0) << 0x20,auVar70);
    fVar193 = auVar20._0_4_;
    fVar245 = auVar20._4_4_;
    fVar255 = auVar20._8_4_;
    fVar272 = auVar20._12_4_;
    fVar291 = auVar20._16_4_;
    fVar11 = auVar20._20_4_;
    fVar18 = auVar20._24_4_;
    auVar316._0_4_ = local_580 * fVar193 + local_560 * fVar222 + local_7e0 * fVar192;
    auVar316._4_4_ = fStack_57c * fVar245 + fStack_55c * fVar244 + fStack_7dc * fVar223;
    auVar316._8_4_ = fStack_578 * fVar255 + fStack_558 * fVar253 + fStack_7d8 * fVar252;
    auVar316._12_4_ = fStack_574 * fVar272 + fStack_554 * fVar271 + fStack_7d4 * fVar264;
    auVar316._16_4_ = fStack_570 * fVar291 + fStack_550 * fVar290 + fStack_7d0 * fVar289;
    auVar316._20_4_ = fStack_56c * fVar11 + fStack_54c * fVar333 + fStack_7cc * fVar315;
    auVar316._24_4_ = fStack_568 * fVar18 + fStack_548 * fVar17 + fStack_7c8 * fVar16;
    auVar316._28_4_ = fVar248 + auVar160._28_4_ + auVar22._28_4_ + fVar248 + auVar19._28_4_;
    auVar336._0_4_ = fVar193 * fVar193 + fVar222 * fVar222 + fVar192 * fVar192;
    auVar336._4_4_ = fVar245 * fVar245 + fVar244 * fVar244 + fVar223 * fVar223;
    auVar336._8_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar252 * fVar252;
    auVar336._12_4_ = fVar272 * fVar272 + fVar271 * fVar271 + fVar264 * fVar264;
    auVar336._16_4_ = fVar291 * fVar291 + fVar290 * fVar290 + fVar289 * fVar289;
    auVar336._20_4_ = fVar11 * fVar11 + fVar333 * fVar333 + fVar315 * fVar315;
    auVar336._24_4_ = fVar18 * fVar18 + fVar17 * fVar17 + fVar16 * fVar16;
    auVar336._28_4_ = fVar230 + fVar230 + fVar248;
    fVar230 = local_460._0_4_;
    fVar248 = local_460._4_4_;
    fVar256 = local_460._8_4_;
    fVar274 = local_460._12_4_;
    fVar292 = local_460._16_4_;
    fVar226 = local_460._20_4_;
    fVar228 = local_460._24_4_;
    auVar286._8_4_ = 0x3f800000;
    auVar286._0_8_ = 0x3f8000003f800000;
    auVar286._12_4_ = 0x3f800000;
    auVar286._16_4_ = 0x3f800000;
    auVar286._20_4_ = 0x3f800000;
    auVar286._24_4_ = 0x3f800000;
    auVar286._28_4_ = 0x3f800000;
    fVar207 = local_6e0._28_4_;
    auVar301 = ZEXT3264(local_460);
    fVar231 = local_460._28_4_;
    local_6a0._0_4_ =
         local_580 * fVar191 * fVar230 +
         local_560 * fVar173 * fVar230 + fVar220 * fVar230 * local_7e0;
    local_6a0._4_4_ =
         fStack_57c * fVar251 * fVar248 +
         fStack_55c * fVar243 * fVar248 + fVar247 * fVar248 * fStack_7dc;
    fStack_698 = fStack_578 * fVar225 * fVar256 +
                 fStack_558 * fVar249 * fVar256 + fVar224 * fVar256 * fStack_7d8;
    fStack_694 = fStack_574 * fVar261 * fVar274 +
                 fStack_554 * fVar258 * fVar274 + fVar259 * fVar274 * fStack_7d4;
    fStack_690 = fStack_570 * fVar280 * fVar292 +
                 fStack_550 * fVar276 * fVar292 + fVar278 * fVar292 * fStack_7d0;
    fStack_68c = fStack_56c * fVar295 * fVar226 +
                 fStack_54c * fVar293 * fVar226 + fVar294 * fVar226 * fStack_7cc;
    fStack_688 = fStack_568 * fVar14 * fVar228 +
                 fStack_548 * fVar12 * fVar228 + fVar13 * fVar228 * fStack_7c8;
    fVar229 = fVar231 + fVar207 + 0.0;
    local_6c0 = fVar193 * fVar191 * fVar230 +
                fVar173 * fVar230 * fVar222 + fVar220 * fVar230 * fVar192;
    fStack_6bc = fVar245 * fVar251 * fVar248 +
                 fVar243 * fVar248 * fVar244 + fVar247 * fVar248 * fVar223;
    fStack_6b8 = fVar255 * fVar225 * fVar256 +
                 fVar249 * fVar256 * fVar253 + fVar224 * fVar256 * fVar252;
    fStack_6b4 = fVar272 * fVar261 * fVar274 +
                 fVar258 * fVar274 * fVar271 + fVar259 * fVar274 * fVar264;
    fStack_6b0 = fVar291 * fVar280 * fVar292 +
                 fVar276 * fVar292 * fVar290 + fVar278 * fVar292 * fVar289;
    fStack_6ac = fVar11 * fVar295 * fVar226 +
                 fVar293 * fVar226 * fVar333 + fVar294 * fVar226 * fVar315;
    fStack_6a8 = fVar18 * fVar14 * fVar228 + fVar12 * fVar228 * fVar17 + fVar13 * fVar228 * fVar16;
    fStack_6a4 = fVar207 + fVar229;
    auVar36._4_4_ = (float)local_6a0._4_4_ * fStack_6bc;
    auVar36._0_4_ = (float)local_6a0._0_4_ * local_6c0;
    auVar36._8_4_ = fStack_698 * fStack_6b8;
    auVar36._12_4_ = fStack_694 * fStack_6b4;
    auVar36._16_4_ = fStack_690 * fStack_6b0;
    auVar36._20_4_ = fStack_68c * fStack_6ac;
    auVar36._24_4_ = fStack_688 * fStack_6a8;
    auVar36._28_4_ = fVar229;
    auVar19 = vsubps_avx(auVar316,auVar36);
    auVar37._4_4_ = fStack_6bc * fStack_6bc;
    auVar37._0_4_ = local_6c0 * local_6c0;
    auVar37._8_4_ = fStack_6b8 * fStack_6b8;
    auVar37._12_4_ = fStack_6b4 * fStack_6b4;
    auVar37._16_4_ = fStack_6b0 * fStack_6b0;
    auVar37._20_4_ = fStack_6ac * fStack_6ac;
    auVar37._24_4_ = fStack_6a8 * fStack_6a8;
    auVar37._28_4_ = fVar207;
    local_620 = vsubps_avx(auVar336,auVar37);
    local_5a0 = vsqrtps_avx(auVar97);
    fVar229 = (auVar98._0_4_ + local_5a0._0_4_) * 1.0000002;
    fVar108 = (auVar98._4_4_ + local_5a0._4_4_) * 1.0000002;
    fVar109 = (auVar98._8_4_ + local_5a0._8_4_) * 1.0000002;
    fVar110 = (auVar98._12_4_ + local_5a0._12_4_) * 1.0000002;
    fVar111 = (auVar98._16_4_ + local_5a0._16_4_) * 1.0000002;
    fVar112 = (auVar98._20_4_ + local_5a0._20_4_) * 1.0000002;
    fVar113 = (auVar98._24_4_ + local_5a0._24_4_) * 1.0000002;
    auVar38._4_4_ = fVar108 * fVar108;
    auVar38._0_4_ = fVar229 * fVar229;
    auVar38._8_4_ = fVar109 * fVar109;
    auVar38._12_4_ = fVar110 * fVar110;
    auVar38._16_4_ = fVar111 * fVar111;
    auVar38._20_4_ = fVar112 * fVar112;
    auVar38._24_4_ = fVar113 * fVar113;
    auVar38._28_4_ = auVar98._28_4_ + local_5a0._28_4_;
    fVar229 = auVar19._0_4_ + auVar19._0_4_;
    fVar108 = auVar19._4_4_ + auVar19._4_4_;
    local_300._0_8_ = CONCAT44(fVar108,fVar229);
    local_300._8_4_ = auVar19._8_4_ + auVar19._8_4_;
    local_300._12_4_ = auVar19._12_4_ + auVar19._12_4_;
    local_300._16_4_ = auVar19._16_4_ + auVar19._16_4_;
    local_300._20_4_ = auVar19._20_4_ + auVar19._20_4_;
    local_300._24_4_ = auVar19._24_4_ + auVar19._24_4_;
    local_300._28_4_ = auVar19._28_4_ + auVar19._28_4_;
    auVar19 = vsubps_avx(local_620,auVar38);
    auVar338 = ZEXT3264(auVar19);
    local_600._4_4_ = (float)local_6a0._4_4_ * (float)local_6a0._4_4_;
    local_600._0_4_ = (float)local_6a0._0_4_ * (float)local_6a0._0_4_;
    fStack_5f8 = fStack_698 * fStack_698;
    fStack_5f4 = fStack_694 * fStack_694;
    fStack_5f0 = fStack_690 * fStack_690;
    fStack_5ec = fStack_68c * fStack_68c;
    fStack_5e8 = fStack_688 * fStack_688;
    fStack_5e4 = auVar98._28_4_;
    local_480 = vsubps_avx(local_2c0,_local_600);
    auVar39._4_4_ = fVar108 * fVar108;
    auVar39._0_4_ = fVar229 * fVar229;
    auVar39._8_4_ = local_300._8_4_ * local_300._8_4_;
    auVar39._12_4_ = local_300._12_4_ * local_300._12_4_;
    auVar39._16_4_ = local_300._16_4_ * local_300._16_4_;
    auVar39._20_4_ = local_300._20_4_ * local_300._20_4_;
    auVar39._24_4_ = local_300._24_4_ * local_300._24_4_;
    auVar39._28_4_ = fVar231;
    fVar109 = local_480._0_4_;
    local_920 = fVar109 * 4.0;
    fVar110 = local_480._4_4_;
    fStack_91c = fVar110 * 4.0;
    fVar111 = local_480._8_4_;
    fStack_918 = fVar111 * 4.0;
    fVar112 = local_480._12_4_;
    fStack_914 = fVar112 * 4.0;
    fVar113 = local_480._16_4_;
    fStack_910 = fVar113 * 4.0;
    fVar361 = local_480._20_4_;
    fStack_90c = fVar361 * 4.0;
    fVar362 = local_480._24_4_;
    fStack_908 = fVar362 * 4.0;
    uStack_904 = 0x40800000;
    auVar40._4_4_ = auVar19._4_4_ * fStack_91c;
    auVar40._0_4_ = auVar19._0_4_ * local_920;
    auVar40._8_4_ = auVar19._8_4_ * fStack_918;
    auVar40._12_4_ = auVar19._12_4_ * fStack_914;
    auVar40._16_4_ = auVar19._16_4_ * fStack_910;
    auVar40._20_4_ = auVar19._20_4_ * fStack_90c;
    auVar40._24_4_ = auVar19._24_4_ * fStack_908;
    auVar40._28_4_ = 0x40800000;
    auVar98 = vsubps_avx(auVar39,auVar40);
    auVar97 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,5);
    fStack_684 = fVar231 + fVar207 + 0.0;
    fVar207 = local_480._28_4_;
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0x7f,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar97 >> 0xbf,0) == '\0') &&
        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f]) {
      auVar348._8_4_ = 0x7f800000;
      auVar348._0_8_ = 0x7f8000007f800000;
      auVar348._12_4_ = 0x7f800000;
      auVar348._16_4_ = 0x7f800000;
      auVar348._20_4_ = 0x7f800000;
      auVar348._24_4_ = 0x7f800000;
      auVar348._28_4_ = 0x7f800000;
      auVar324._8_4_ = 0xff800000;
      auVar324._0_8_ = 0xff800000ff800000;
      auVar324._12_4_ = 0xff800000;
      auVar324._16_4_ = 0xff800000;
      auVar324._20_4_ = 0xff800000;
      auVar324._24_4_ = 0xff800000;
      auVar324._28_4_ = 0xff800000;
      auVar237 = local_2c0;
    }
    else {
      auVar21 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,5);
      auVar288 = vsqrtps_avx(auVar98);
      auVar236._0_4_ = fVar109 + fVar109;
      auVar236._4_4_ = fVar110 + fVar110;
      auVar236._8_4_ = fVar111 + fVar111;
      auVar236._12_4_ = fVar112 + fVar112;
      auVar236._16_4_ = fVar113 + fVar113;
      auVar236._20_4_ = fVar361 + fVar361;
      auVar236._24_4_ = fVar362 + fVar362;
      auVar236._28_4_ = fVar207 + fVar207;
      auVar98 = vrcpps_avx(auVar236);
      fVar231 = auVar98._0_4_;
      fVar246 = auVar98._4_4_;
      auVar41._4_4_ = auVar236._4_4_ * fVar246;
      auVar41._0_4_ = auVar236._0_4_ * fVar231;
      fVar250 = auVar98._8_4_;
      auVar41._8_4_ = auVar236._8_4_ * fVar250;
      fVar254 = auVar98._12_4_;
      auVar41._12_4_ = auVar236._12_4_ * fVar254;
      fVar257 = auVar98._16_4_;
      auVar41._16_4_ = auVar236._16_4_ * fVar257;
      fVar260 = auVar98._20_4_;
      auVar41._20_4_ = auVar236._20_4_ * fVar260;
      fVar263 = auVar98._24_4_;
      auVar41._24_4_ = auVar236._24_4_ * fVar263;
      auVar41._28_4_ = auVar236._28_4_;
      auVar98 = vsubps_avx(auVar286,auVar41);
      fVar231 = fVar231 + fVar231 * auVar98._0_4_;
      fVar246 = fVar246 + fVar246 * auVar98._4_4_;
      fVar250 = fVar250 + fVar250 * auVar98._8_4_;
      fVar254 = fVar254 + fVar254 * auVar98._12_4_;
      fVar257 = fVar257 + fVar257 * auVar98._16_4_;
      fVar260 = fVar260 + fVar260 * auVar98._20_4_;
      fVar263 = fVar263 + fVar263 * auVar98._24_4_;
      auVar268._0_8_ = CONCAT44(fVar108,fVar229) ^ 0x8000000080000000;
      auVar268._8_4_ = -local_300._8_4_;
      auVar268._12_4_ = -local_300._12_4_;
      auVar268._16_4_ = -local_300._16_4_;
      auVar268._20_4_ = -local_300._20_4_;
      auVar268._24_4_ = -local_300._24_4_;
      auVar268._28_4_ = -local_300._28_4_;
      auVar98 = vsubps_avx(auVar268,auVar288);
      fVar229 = auVar98._0_4_ * fVar231;
      fVar108 = auVar98._4_4_ * fVar246;
      auVar42._4_4_ = fVar108;
      auVar42._0_4_ = fVar229;
      fVar273 = auVar98._8_4_ * fVar250;
      auVar42._8_4_ = fVar273;
      fVar275 = auVar98._12_4_ * fVar254;
      auVar42._12_4_ = fVar275;
      fVar277 = auVar98._16_4_ * fVar257;
      auVar42._16_4_ = fVar277;
      fVar279 = auVar98._20_4_ * fVar260;
      auVar42._20_4_ = fVar279;
      fVar281 = auVar98._24_4_ * fVar263;
      auVar42._24_4_ = fVar281;
      auVar42._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(auVar288,local_300);
      fVar231 = auVar98._0_4_ * fVar231;
      fVar246 = auVar98._4_4_ * fVar246;
      auVar43._4_4_ = fVar246;
      auVar43._0_4_ = fVar231;
      fVar250 = auVar98._8_4_ * fVar250;
      auVar43._8_4_ = fVar250;
      fVar254 = auVar98._12_4_ * fVar254;
      auVar43._12_4_ = fVar254;
      fVar257 = auVar98._16_4_ * fVar257;
      auVar43._16_4_ = fVar257;
      fVar260 = auVar98._20_4_ * fVar260;
      auVar43._20_4_ = fVar260;
      fVar263 = auVar98._24_4_ * fVar263;
      auVar43._24_4_ = fVar263;
      auVar43._28_4_ = auVar98._28_4_;
      local_640._4_4_ = fVar248 * (fStack_6bc + (float)local_6a0._4_4_ * fVar108);
      local_640._0_4_ = fVar230 * (local_6c0 + (float)local_6a0._0_4_ * fVar229);
      fStack_638 = fVar256 * (fStack_6b8 + fStack_698 * fVar273);
      fStack_634 = fVar274 * (fStack_6b4 + fStack_694 * fVar275);
      fStack_630 = fVar292 * (fStack_6b0 + fStack_690 * fVar277);
      fStack_62c = fVar226 * (fStack_6ac + fStack_68c * fVar279);
      fStack_628 = fVar228 * (fStack_6a8 + fStack_688 * fVar281);
      uStack_624 = 0x40800000;
      auVar317._8_4_ = 0x7fffffff;
      auVar317._0_8_ = 0x7fffffff7fffffff;
      auVar317._12_4_ = 0x7fffffff;
      auVar317._16_4_ = 0x7fffffff;
      auVar317._20_4_ = 0x7fffffff;
      auVar317._24_4_ = 0x7fffffff;
      auVar317._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(_local_600,auVar317);
      auVar98 = vmaxps_avx(local_440,auVar98);
      auVar44._4_4_ = auVar98._4_4_ * 1.9073486e-06;
      auVar44._0_4_ = auVar98._0_4_ * 1.9073486e-06;
      auVar44._8_4_ = auVar98._8_4_ * 1.9073486e-06;
      auVar44._12_4_ = auVar98._12_4_ * 1.9073486e-06;
      auVar44._16_4_ = auVar98._16_4_ * 1.9073486e-06;
      auVar44._20_4_ = auVar98._20_4_ * 1.9073486e-06;
      auVar44._24_4_ = auVar98._24_4_ * 1.9073486e-06;
      auVar44._28_4_ = auVar98._28_4_;
      auVar98 = vandps_avx(local_480,auVar317);
      auVar98 = vcmpps_avx(auVar98,auVar44,1);
      auVar287._8_4_ = 0x7f800000;
      auVar287._0_8_ = 0x7f8000007f800000;
      auVar287._12_4_ = 0x7f800000;
      auVar287._16_4_ = 0x7f800000;
      auVar287._20_4_ = 0x7f800000;
      auVar287._24_4_ = 0x7f800000;
      auVar287._28_4_ = 0x7f800000;
      auVar348 = vblendvps_avx(auVar287,auVar42,auVar21);
      local_660 = fVar230 * (local_6c0 + (float)local_6a0._0_4_ * fVar231);
      fStack_65c = fVar248 * (fStack_6bc + (float)local_6a0._4_4_ * fVar246);
      fStack_658 = fVar256 * (fStack_6b8 + fStack_698 * fVar250);
      fStack_654 = fVar274 * (fStack_6b4 + fStack_694 * fVar254);
      fStack_650 = fVar292 * (fStack_6b0 + fStack_690 * fVar257);
      fStack_64c = fVar226 * (fStack_6ac + fStack_68c * fVar260);
      fStack_648 = fVar228 * (fStack_6a8 + fStack_688 * fVar263);
      uStack_644 = 0x40800000;
      auVar237._8_4_ = 0xff800000;
      auVar237._0_8_ = 0xff800000ff800000;
      auVar237._12_4_ = 0xff800000;
      auVar237._16_4_ = 0xff800000;
      auVar237._20_4_ = 0xff800000;
      auVar237._24_4_ = 0xff800000;
      auVar237._28_4_ = 0xff800000;
      auVar324 = vblendvps_avx(auVar237,auVar43,auVar21);
      auVar288 = auVar21 & auVar98;
      if ((((((((auVar288 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar288 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar288 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar288 >> 0x7f,0) != '\0') ||
            (auVar288 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar288 >> 0xbf,0) != '\0') ||
          (auVar288 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar288[0x1f] < '\0') {
        auVar97 = vandps_avx(auVar98,auVar21);
        auVar96 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
        auVar288 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar237 = vcmpps_avx(auVar19,auVar288,2);
        auVar206._8_4_ = 0xff800000;
        auVar206._0_8_ = 0xff800000ff800000;
        auVar206._12_4_ = 0xff800000;
        auVar206._16_4_ = 0xff800000;
        auVar206._20_4_ = 0xff800000;
        auVar206._24_4_ = 0xff800000;
        auVar206._28_4_ = 0xff800000;
        auVar337._8_4_ = 0x7f800000;
        auVar337._0_8_ = 0x7f8000007f800000;
        auVar337._12_4_ = 0x7f800000;
        auVar337._16_4_ = 0x7f800000;
        auVar337._20_4_ = 0x7f800000;
        auVar337._24_4_ = 0x7f800000;
        auVar337._28_4_ = 0x7f800000;
        auVar338 = ZEXT3264(auVar337);
        auVar98 = vblendvps_avx(auVar337,auVar206,auVar237);
        auVar90 = vpmovsxwd_avx(auVar96);
        auVar96 = vpunpckhwd_avx(auVar96,auVar96);
        auVar218._16_16_ = auVar96;
        auVar218._0_16_ = auVar90;
        auVar348 = vblendvps_avx(auVar348,auVar98,auVar218);
        auVar98 = vblendvps_avx(auVar206,auVar337,auVar237);
        auVar324 = vblendvps_avx(auVar324,auVar98,auVar218);
        auVar98 = vcmpps_avx(auVar288,ZEXT1232(ZEXT812(0)) << 0x20,0xf);
        auVar106._0_4_ = auVar97._0_4_ ^ auVar98._0_4_;
        auVar106._4_4_ = auVar97._4_4_ ^ auVar98._4_4_;
        auVar106._8_4_ = auVar97._8_4_ ^ auVar98._8_4_;
        auVar106._12_4_ = auVar97._12_4_ ^ auVar98._12_4_;
        auVar106._16_4_ = auVar97._16_4_ ^ auVar98._16_4_;
        auVar106._20_4_ = auVar97._20_4_ ^ auVar98._20_4_;
        auVar106._24_4_ = auVar97._24_4_ ^ auVar98._24_4_;
        auVar106._28_4_ = auVar97._28_4_ ^ auVar98._28_4_;
        auVar97 = vorps_avx(auVar237,auVar106);
        auVar97 = vandps_avx(auVar21,auVar97);
      }
    }
    auVar326 = ZEXT3264(auVar324);
    auVar242 = ZEXT3264(auVar237);
    auVar321 = ZEXT3264(CONCAT428(fStack_7c4,
                                  CONCAT424(fStack_7c8,
                                            CONCAT420(fStack_7cc,
                                                      CONCAT416(fStack_7d0,
                                                                CONCAT412(fStack_7d4,
                                                                          CONCAT48(fStack_7d8,
                                                                                   CONCAT44(
                                                  fStack_7dc,local_7e0))))))));
    auVar98 = local_2e0 & auVar97;
    auVar270 = ZEXT3264(CONCAT428(fStack_544,
                                  CONCAT424(fStack_548,
                                            CONCAT420(fStack_54c,
                                                      CONCAT416(fStack_550,
                                                                CONCAT412(fStack_554,
                                                                          CONCAT48(fStack_558,
                                                                                   CONCAT44(
                                                  fStack_55c,local_560))))))));
    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar98 >> 0x7f,0) != '\0') ||
          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar98 >> 0xbf,0) != '\0') ||
        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar98[0x1f] < '\0')
    {
      auVar96 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_850._0_4_));
      auVar96 = vshufps_avx(auVar96,auVar96,0);
      auVar212._16_16_ = auVar96;
      auVar212._0_16_ = auVar96;
      auVar21 = vmaxps_avx(auVar212,auVar348);
      auVar96 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_850._0_4_));
      auVar96 = vshufps_avx(auVar96,auVar96,0);
      auVar213._16_16_ = auVar96;
      auVar213._0_16_ = auVar96;
      auVar288 = vminps_avx(auVar213,auVar324);
      fVar260 = local_620._28_4_;
      auVar159._0_4_ = local_580 * fVar334 + local_560 * fVar323 + local_7e0 * fVar296;
      auVar159._4_4_ = fStack_57c * fVar339 + fStack_55c * fVar327 + fStack_7dc * fVar302;
      auVar159._8_4_ = fStack_578 * fVar340 + fStack_558 * fVar328 + fStack_7d8 * fVar304;
      auVar159._12_4_ = fStack_574 * fVar341 + fStack_554 * fVar329 + fStack_7d4 * fVar306;
      auVar159._16_4_ = fStack_570 * fVar342 + fStack_550 * fVar330 + fStack_7d0 * fVar308;
      auVar159._20_4_ = fStack_56c * fVar343 + fStack_54c * fVar331 + fStack_7cc * fVar310;
      auVar159._24_4_ = fStack_568 * fVar344 + fStack_548 * fVar332 + fStack_7c8 * fVar312;
      auVar159._28_4_ = fVar260 + fVar260 + auVar20._28_4_;
      auVar98 = vrcpps_avx(auVar159);
      fVar231 = auVar98._0_4_;
      fVar229 = auVar98._4_4_;
      auVar45._4_4_ = auVar159._4_4_ * fVar229;
      auVar45._0_4_ = auVar159._0_4_ * fVar231;
      fVar108 = auVar98._8_4_;
      auVar45._8_4_ = auVar159._8_4_ * fVar108;
      fVar246 = auVar98._12_4_;
      auVar45._12_4_ = auVar159._12_4_ * fVar246;
      fVar250 = auVar98._16_4_;
      auVar45._16_4_ = auVar159._16_4_ * fVar250;
      fVar254 = auVar98._20_4_;
      auVar45._20_4_ = auVar159._20_4_ * fVar254;
      fVar257 = auVar98._24_4_;
      auVar45._24_4_ = auVar159._24_4_ * fVar257;
      auVar45._28_4_ = uStack_1c4;
      auVar349._8_4_ = 0x3f800000;
      auVar349._0_8_ = 0x3f8000003f800000;
      auVar349._12_4_ = 0x3f800000;
      auVar349._16_4_ = 0x3f800000;
      auVar349._20_4_ = 0x3f800000;
      auVar349._24_4_ = 0x3f800000;
      auVar349._28_4_ = 0x3f800000;
      auVar19 = vsubps_avx(auVar349,auVar45);
      auVar300._8_4_ = 0x7fffffff;
      auVar300._0_8_ = 0x7fffffff7fffffff;
      auVar300._12_4_ = 0x7fffffff;
      auVar300._16_4_ = 0x7fffffff;
      auVar300._20_4_ = 0x7fffffff;
      auVar300._24_4_ = 0x7fffffff;
      auVar300._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar300,auVar159);
      auVar359._8_4_ = 0x219392ef;
      auVar359._0_8_ = 0x219392ef219392ef;
      auVar359._12_4_ = 0x219392ef;
      auVar359._16_4_ = 0x219392ef;
      auVar359._20_4_ = 0x219392ef;
      auVar359._24_4_ = 0x219392ef;
      auVar359._28_4_ = 0x219392ef;
      auVar98 = vcmpps_avx(auVar98,auVar359,1);
      auVar46._4_4_ =
           (fVar229 + fVar229 * auVar19._4_4_) *
           -(fVar339 * fVar245 + fVar327 * fVar244 + fVar302 * fVar223);
      auVar46._0_4_ =
           (fVar231 + fVar231 * auVar19._0_4_) *
           -(fVar334 * fVar193 + fVar323 * fVar222 + fVar296 * fVar192);
      auVar46._8_4_ =
           (fVar108 + fVar108 * auVar19._8_4_) *
           -(fVar340 * fVar255 + fVar328 * fVar253 + fVar304 * fVar252);
      auVar46._12_4_ =
           (fVar246 + fVar246 * auVar19._12_4_) *
           -(fVar341 * fVar272 + fVar329 * fVar271 + fVar306 * fVar264);
      auVar46._16_4_ =
           (fVar250 + fVar250 * auVar19._16_4_) *
           -(fVar342 * fVar291 + fVar330 * fVar290 + fVar308 * fVar289);
      auVar46._20_4_ =
           (fVar254 + fVar254 * auVar19._20_4_) *
           -(fVar343 * fVar11 + fVar331 * fVar333 + fVar310 * fVar315);
      auVar46._24_4_ =
           (fVar257 + fVar257 * auVar19._24_4_) *
           -(fVar344 * fVar18 + fVar332 * fVar17 + fVar312 * fVar16);
      auVar46._28_4_ = -(auVar20._28_4_ + local_300._28_4_ + fVar260);
      auVar270 = ZEXT864(0) << 0x20;
      auVar19 = vcmpps_avx(auVar159,ZEXT832(0) << 0x20,1);
      auVar20 = vorps_avx(auVar98,auVar19);
      auVar19 = vcmpps_avx(auVar159,ZEXT832(0) << 0x20,6);
      auVar19 = vorps_avx(auVar98,auVar19);
      auVar318._8_4_ = 0xff800000;
      auVar318._0_8_ = 0xff800000ff800000;
      auVar318._12_4_ = 0xff800000;
      auVar318._16_4_ = 0xff800000;
      auVar318._20_4_ = 0xff800000;
      auVar318._24_4_ = 0xff800000;
      auVar318._28_4_ = 0xff800000;
      auVar321 = ZEXT3264(auVar318);
      auVar98 = vblendvps_avx(auVar46,auVar318,auVar20);
      auVar325._8_4_ = 0x7f800000;
      auVar325._0_8_ = 0x7f8000007f800000;
      auVar325._12_4_ = 0x7f800000;
      auVar325._16_4_ = 0x7f800000;
      auVar325._20_4_ = 0x7f800000;
      auVar325._24_4_ = 0x7f800000;
      auVar325._28_4_ = 0x7f800000;
      auVar326 = ZEXT3264(auVar325);
      auVar19 = vblendvps_avx(auVar46,auVar325,auVar19);
      auVar20 = vmaxps_avx(auVar21,auVar98);
      auVar21 = vminps_avx(auVar288,auVar19);
      auVar269 = ZEXT832(0) << 0x20;
      auVar98 = vsubps_avx(auVar269,local_880);
      auVar19 = vsubps_avx(auVar269,local_9c0);
      auVar47._4_4_ = auVar19._4_4_ * -fVar322;
      auVar47._0_4_ = auVar19._0_4_ * -fVar221;
      auVar47._8_4_ = auVar19._8_4_ * -fVar227;
      auVar47._12_4_ = auVar19._12_4_ * -fVar262;
      auVar47._16_4_ = auVar19._16_4_ * -fVar282;
      auVar47._20_4_ = auVar19._20_4_ * -fVar314;
      auVar47._24_4_ = auVar19._24_4_ * -fVar15;
      auVar47._28_4_ = auVar19._28_4_;
      auVar338 = ZEXT3264(local_900);
      auVar48._4_4_ = fVar352 * auVar98._4_4_;
      auVar48._0_4_ = fVar345 * auVar98._0_4_;
      auVar48._8_4_ = fVar353 * auVar98._8_4_;
      auVar48._12_4_ = fVar354 * auVar98._12_4_;
      auVar48._16_4_ = fVar355 * auVar98._16_4_;
      auVar48._20_4_ = fVar356 * auVar98._20_4_;
      auVar48._24_4_ = fVar357 * auVar98._24_4_;
      auVar48._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(auVar47,auVar48);
      auVar19 = vsubps_avx(auVar269,local_740);
      auVar301 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar49._4_4_ = fVar303 * auVar19._4_4_;
      auVar49._0_4_ = fVar297 * auVar19._0_4_;
      auVar49._8_4_ = fVar305 * auVar19._8_4_;
      auVar49._12_4_ = fVar307 * auVar19._12_4_;
      auVar49._16_4_ = fVar309 * auVar19._16_4_;
      auVar49._20_4_ = fVar311 * auVar19._20_4_;
      uVar1 = auVar19._28_4_;
      auVar49._24_4_ = fVar313 * auVar19._24_4_;
      auVar49._28_4_ = uVar1;
      auVar288 = vsubps_avx(auVar98,auVar49);
      auVar50._4_4_ = fStack_7dc * -fVar322;
      auVar50._0_4_ = local_7e0 * -fVar221;
      auVar50._8_4_ = fStack_7d8 * -fVar227;
      auVar50._12_4_ = fStack_7d4 * -fVar262;
      auVar50._16_4_ = fStack_7d0 * -fVar282;
      auVar50._20_4_ = fStack_7cc * -fVar314;
      auVar50._24_4_ = fStack_7c8 * -fVar15;
      auVar50._28_4_ = local_780._28_4_ ^ 0x80000000;
      auVar51._4_4_ = fStack_55c * fVar352;
      auVar51._0_4_ = local_560 * fVar345;
      auVar51._8_4_ = fStack_558 * fVar353;
      auVar51._12_4_ = fStack_554 * fVar354;
      auVar51._16_4_ = fStack_550 * fVar355;
      auVar51._20_4_ = fStack_54c * fVar356;
      auVar51._24_4_ = fStack_548 * fVar357;
      auVar51._28_4_ = uVar1;
      auVar350._8_4_ = 0x3f800000;
      auVar350._0_8_ = 0x3f8000003f800000;
      auVar350._12_4_ = 0x3f800000;
      auVar350._16_4_ = 0x3f800000;
      auVar350._20_4_ = 0x3f800000;
      auVar350._24_4_ = 0x3f800000;
      auVar350._28_4_ = 0x3f800000;
      auVar98 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = fStack_57c * fVar303;
      auVar52._0_4_ = local_580 * fVar297;
      auVar52._8_4_ = fStack_578 * fVar305;
      auVar52._12_4_ = fStack_574 * fVar307;
      auVar52._16_4_ = fStack_570 * fVar309;
      auVar52._20_4_ = fStack_56c * fVar311;
      auVar52._24_4_ = fStack_568 * fVar313;
      auVar52._28_4_ = uVar1;
      auVar160 = vsubps_avx(auVar98,auVar52);
      auVar98 = vrcpps_avx(auVar160);
      fVar221 = auVar98._0_4_;
      fVar192 = auVar98._4_4_;
      auVar53._4_4_ = auVar160._4_4_ * fVar192;
      auVar53._0_4_ = auVar160._0_4_ * fVar221;
      fVar222 = auVar98._8_4_;
      auVar53._8_4_ = auVar160._8_4_ * fVar222;
      fVar193 = auVar98._12_4_;
      auVar53._12_4_ = auVar160._12_4_ * fVar193;
      fVar322 = auVar98._16_4_;
      auVar53._16_4_ = auVar160._16_4_ * fVar322;
      fVar223 = auVar98._20_4_;
      auVar53._20_4_ = auVar160._20_4_ * fVar223;
      fVar244 = auVar98._24_4_;
      auVar53._24_4_ = auVar160._24_4_ * fVar244;
      auVar53._28_4_ = fStack_564;
      auVar22 = vsubps_avx(auVar350,auVar53);
      auVar100._8_4_ = 0x7fffffff;
      auVar100._0_8_ = 0x7fffffff7fffffff;
      auVar100._12_4_ = 0x7fffffff;
      auVar100._16_4_ = 0x7fffffff;
      auVar100._20_4_ = 0x7fffffff;
      auVar100._24_4_ = 0x7fffffff;
      auVar100._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar160,auVar100);
      auVar19 = vcmpps_avx(auVar98,auVar359,1);
      auVar242 = ZEXT3264(auVar19);
      auVar54._4_4_ = (fVar192 + fVar192 * auVar22._4_4_) * -auVar288._4_4_;
      auVar54._0_4_ = (fVar221 + fVar221 * auVar22._0_4_) * -auVar288._0_4_;
      auVar54._8_4_ = (fVar222 + fVar222 * auVar22._8_4_) * -auVar288._8_4_;
      auVar54._12_4_ = (fVar193 + fVar193 * auVar22._12_4_) * -auVar288._12_4_;
      auVar54._16_4_ = (fVar322 + fVar322 * auVar22._16_4_) * -auVar288._16_4_;
      auVar54._20_4_ = (fVar223 + fVar223 * auVar22._20_4_) * -auVar288._20_4_;
      auVar54._24_4_ = (fVar244 + fVar244 * auVar22._24_4_) * -auVar288._24_4_;
      auVar54._28_4_ = auVar288._28_4_ ^ 0x80000000;
      auVar98 = vcmpps_avx(auVar160,auVar269,1);
      auVar98 = vorps_avx(auVar19,auVar98);
      auVar98 = vblendvps_avx(auVar54,auVar318,auVar98);
      _local_8e0 = vmaxps_avx(auVar20,auVar98);
      auVar98 = vcmpps_avx(auVar160,ZEXT832(0) << 0x20,6);
      auVar98 = vorps_avx(auVar19,auVar98);
      auVar98 = vblendvps_avx(auVar54,auVar325,auVar98);
      auVar97 = vandps_avx(local_2e0,auVar97);
      local_4e0 = vminps_avx(auVar21,auVar98);
      auVar98 = vcmpps_avx(_local_8e0,local_4e0,2);
      auVar19 = auVar97 & auVar98;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar19 = vminps_avx(_local_aa0,_local_680);
        auVar20 = vminps_avx(_local_820,_local_840);
        auVar19 = vminps_avx(auVar19,auVar20);
        auVar19 = vsubps_avx(auVar19,local_5a0);
        auVar97 = vandps_avx(auVar98,auVar97);
        auVar98 = vminps_avx(_local_640,auVar350);
        auVar98 = vmaxps_avx(auVar98,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar146 + fVar114 * (auVar98._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar170 + fVar135 * (auVar98._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar171 + fVar137 * (auVar98._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar172 + fVar140 * (auVar98._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar146 + fVar114 * (auVar98._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar170 + fVar135 * (auVar98._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar171 + fVar137 * (auVar98._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar172 + auVar98._28_4_ + 7.0;
        auVar75._4_4_ = fStack_65c;
        auVar75._0_4_ = local_660;
        auVar75._8_4_ = fStack_658;
        auVar75._12_4_ = fStack_654;
        auVar75._16_4_ = fStack_650;
        auVar75._20_4_ = fStack_64c;
        auVar75._24_4_ = fStack_648;
        auVar75._28_4_ = uStack_644;
        auVar98 = vminps_avx(auVar75,auVar350);
        auVar98 = vmaxps_avx(auVar98,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar146 + fVar114 * (auVar98._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar170 + fVar135 * (auVar98._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar171 + fVar137 * (auVar98._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar172 + fVar140 * (auVar98._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar146 + fVar114 * (auVar98._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar170 + fVar135 * (auVar98._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar171 + fVar137 * (auVar98._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar172 + auVar98._28_4_ + 7.0;
        auVar55._4_4_ = auVar19._4_4_ * 0.99999976;
        auVar55._0_4_ = auVar19._0_4_ * 0.99999976;
        auVar55._8_4_ = auVar19._8_4_ * 0.99999976;
        auVar55._12_4_ = auVar19._12_4_ * 0.99999976;
        auVar55._16_4_ = auVar19._16_4_ * 0.99999976;
        auVar55._20_4_ = auVar19._20_4_ * 0.99999976;
        auVar55._24_4_ = auVar19._24_4_ * 0.99999976;
        auVar55._28_4_ = 0x3f7ffffc;
        auVar98 = vmaxps_avx(ZEXT832(0) << 0x20,auVar55);
        auVar56._4_4_ = auVar98._4_4_ * auVar98._4_4_;
        auVar56._0_4_ = auVar98._0_4_ * auVar98._0_4_;
        auVar56._8_4_ = auVar98._8_4_ * auVar98._8_4_;
        auVar56._12_4_ = auVar98._12_4_ * auVar98._12_4_;
        auVar56._16_4_ = auVar98._16_4_ * auVar98._16_4_;
        auVar56._20_4_ = auVar98._20_4_ * auVar98._20_4_;
        auVar56._24_4_ = auVar98._24_4_ * auVar98._24_4_;
        auVar56._28_4_ = auVar98._28_4_;
        auVar19 = vsubps_avx(local_620,auVar56);
        auVar57._4_4_ = auVar19._4_4_ * fStack_91c;
        auVar57._0_4_ = auVar19._0_4_ * local_920;
        auVar57._8_4_ = auVar19._8_4_ * fStack_918;
        auVar57._12_4_ = auVar19._12_4_ * fStack_914;
        auVar57._16_4_ = auVar19._16_4_ * fStack_910;
        auVar57._20_4_ = auVar19._20_4_ * fStack_90c;
        auVar57._24_4_ = auVar19._24_4_ * fStack_908;
        auVar57._28_4_ = auVar98._28_4_;
        auVar20 = vsubps_avx(auVar39,auVar57);
        auVar98 = vcmpps_avx(auVar20,ZEXT832(0) << 0x20,5);
        auVar21 = _local_8e0;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0x7f,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0xbf,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar98[0x1f]) {
          _local_820 = ZEXT832(0) << 0x20;
          _local_840 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          auVar160 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar347 = ZEXT828(0) << 0x20;
          auVar186 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar214._8_4_ = 0x7f800000;
          auVar214._0_8_ = 0x7f8000007f800000;
          auVar214._12_4_ = 0x7f800000;
          auVar214._16_4_ = 0x7f800000;
          auVar214._20_4_ = 0x7f800000;
          auVar214._24_4_ = 0x7f800000;
          auVar214._28_4_ = 0x7f800000;
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
        }
        else {
          local_9c0 = auVar19;
          local_880 = auVar98;
          auVar160 = vsqrtps_avx(auVar20);
          auVar161._0_4_ = fVar109 + fVar109;
          auVar161._4_4_ = fVar110 + fVar110;
          auVar161._8_4_ = fVar111 + fVar111;
          auVar161._12_4_ = fVar112 + fVar112;
          auVar161._16_4_ = fVar113 + fVar113;
          auVar161._20_4_ = fVar361 + fVar361;
          auVar161._24_4_ = fVar362 + fVar362;
          auVar161._28_4_ = fVar207 + fVar207;
          auVar288 = vrcpps_avx(auVar161);
          fVar207 = auVar288._0_4_;
          fVar221 = auVar288._4_4_;
          auVar58._4_4_ = auVar161._4_4_ * fVar221;
          auVar58._0_4_ = auVar161._0_4_ * fVar207;
          fVar192 = auVar288._8_4_;
          auVar58._8_4_ = auVar161._8_4_ * fVar192;
          fVar222 = auVar288._12_4_;
          auVar58._12_4_ = auVar161._12_4_ * fVar222;
          fVar193 = auVar288._16_4_;
          auVar58._16_4_ = auVar161._16_4_ * fVar193;
          fVar322 = auVar288._20_4_;
          auVar58._20_4_ = auVar161._20_4_ * fVar322;
          fVar223 = auVar288._24_4_;
          auVar58._24_4_ = auVar161._24_4_ * fVar223;
          auVar58._28_4_ = auVar161._28_4_;
          auVar22 = vsubps_avx(auVar350,auVar58);
          fVar207 = fVar207 + fVar207 * auVar22._0_4_;
          fVar221 = fVar221 + fVar221 * auVar22._4_4_;
          fVar192 = fVar192 + fVar192 * auVar22._8_4_;
          fVar222 = fVar222 + fVar222 * auVar22._12_4_;
          fVar193 = fVar193 + fVar193 * auVar22._16_4_;
          fVar322 = fVar322 + fVar322 * auVar22._20_4_;
          fVar223 = fVar223 + fVar223 * auVar22._24_4_;
          fVar244 = auVar288._28_4_ + auVar22._28_4_;
          auVar188._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
          auVar188._8_4_ = -local_300._8_4_;
          auVar188._12_4_ = -local_300._12_4_;
          auVar188._16_4_ = -local_300._16_4_;
          auVar188._20_4_ = -local_300._20_4_;
          auVar188._24_4_ = -local_300._24_4_;
          auVar188._28_4_ = -local_300._28_4_;
          auVar288 = vsubps_avx(auVar188,auVar160);
          fVar271 = auVar288._0_4_ * fVar207;
          fVar272 = auVar288._4_4_ * fVar221;
          auVar59._4_4_ = fVar272;
          auVar59._0_4_ = fVar271;
          fVar282 = auVar288._8_4_ * fVar192;
          auVar59._8_4_ = fVar282;
          fVar289 = auVar288._12_4_ * fVar222;
          auVar59._12_4_ = fVar289;
          fVar290 = auVar288._16_4_ * fVar193;
          auVar59._16_4_ = fVar290;
          fVar291 = auVar288._20_4_ * fVar322;
          auVar59._20_4_ = fVar291;
          fVar314 = auVar288._24_4_ * fVar223;
          auVar59._24_4_ = fVar314;
          auVar59._28_4_ = 0x3f800000;
          auVar160 = vsubps_avx(auVar160,local_300);
          fVar207 = auVar160._0_4_ * fVar207;
          fVar221 = auVar160._4_4_ * fVar221;
          auVar60._4_4_ = fVar221;
          auVar60._0_4_ = fVar207;
          fVar192 = auVar160._8_4_ * fVar192;
          auVar60._8_4_ = fVar192;
          fVar222 = auVar160._12_4_ * fVar222;
          auVar60._12_4_ = fVar222;
          fVar193 = auVar160._16_4_ * fVar193;
          auVar60._16_4_ = fVar193;
          fVar322 = auVar160._20_4_ * fVar322;
          auVar60._20_4_ = fVar322;
          fVar223 = auVar160._24_4_ * fVar223;
          auVar60._24_4_ = fVar223;
          auVar60._28_4_ = auVar97._28_4_;
          fVar245 = (fVar271 * (float)local_6a0._0_4_ + local_6c0) * fVar230;
          fVar227 = (fVar272 * (float)local_6a0._4_4_ + fStack_6bc) * fVar248;
          fVar252 = (fVar282 * fStack_698 + fStack_6b8) * fVar256;
          fVar253 = (fVar289 * fStack_694 + fStack_6b4) * fVar274;
          fVar255 = (fVar290 * fStack_690 + fStack_6b0) * fVar292;
          fVar262 = (fVar291 * fStack_68c + fStack_6ac) * fVar226;
          fVar264 = (fVar314 * fStack_688 + fStack_6a8) * fVar228;
          auVar128._0_4_ = local_8c0 + fVar191 * fVar245;
          auVar128._4_4_ = fStack_8bc + fVar251 * fVar227;
          auVar128._8_4_ = fStack_8b8 + fVar225 * fVar252;
          auVar128._12_4_ = fStack_8b4 + fVar261 * fVar253;
          auVar128._16_4_ = fStack_8b0 + fVar280 * fVar255;
          auVar128._20_4_ = fStack_8ac + fVar295 * fVar262;
          auVar128._24_4_ = fStack_8a8 + fVar14 * fVar264;
          auVar128._28_4_ = fStack_8a4 + auVar160._28_4_ + fStack_6a4;
          auVar61._4_4_ = fStack_57c * fVar272;
          auVar61._0_4_ = local_580 * fVar271;
          auVar61._8_4_ = fStack_578 * fVar282;
          auVar61._12_4_ = fStack_574 * fVar289;
          auVar61._16_4_ = fStack_570 * fVar290;
          auVar61._20_4_ = fStack_56c * fVar291;
          auVar61._24_4_ = fStack_568 * fVar314;
          auVar61._28_4_ = fVar244;
          auVar160 = vsubps_avx(auVar61,auVar128);
          auVar162._0_4_ = fVar115 + fVar173 * fVar245;
          auVar162._4_4_ = fVar136 + fVar243 * fVar227;
          auVar162._8_4_ = fVar138 + fVar249 * fVar252;
          auVar162._12_4_ = fVar141 + fVar258 * fVar253;
          auVar162._16_4_ = fVar142 + fVar276 * fVar255;
          auVar162._20_4_ = fVar143 + fVar293 * fVar262;
          auVar162._24_4_ = fVar144 + fVar12 * fVar264;
          auVar162._28_4_ = fVar145 + fVar244;
          auVar215._0_4_ = local_560 * fVar271;
          auVar215._4_4_ = fStack_55c * fVar272;
          auVar215._8_4_ = fStack_558 * fVar282;
          auVar215._12_4_ = fStack_554 * fVar289;
          auVar215._16_4_ = fStack_550 * fVar290;
          auVar215._20_4_ = fStack_54c * fVar291;
          auVar215._24_4_ = fStack_548 * fVar314;
          auVar215._28_4_ = 0;
          auVar22 = vsubps_avx(auVar215,auVar162);
          auVar189._0_4_ = local_8a0 + fVar220 * fVar245;
          auVar189._4_4_ = fStack_89c + fVar247 * fVar227;
          auVar189._8_4_ = fStack_898 + fVar224 * fVar252;
          auVar189._12_4_ = aStack_894.w + fVar259 * fVar253;
          auVar189._16_4_ = fStack_890 + fVar278 * fVar255;
          auVar189._20_4_ = fStack_88c + fVar294 * fVar262;
          auVar189._24_4_ = fStack_888 + fVar13 * fVar264;
          auVar189._28_4_ = fStack_884 + auVar288._28_4_;
          auVar62._4_4_ = fVar272 * fStack_7dc;
          auVar62._0_4_ = fVar271 * local_7e0;
          auVar62._8_4_ = fVar282 * fStack_7d8;
          auVar62._12_4_ = fVar289 * fStack_7d4;
          auVar62._16_4_ = fVar290 * fStack_7d0;
          auVar62._20_4_ = fVar291 * fStack_7cc;
          auVar62._24_4_ = fVar314 * fStack_7c8;
          auVar62._28_4_ = 0;
          auVar288 = vsubps_avx(auVar62,auVar189);
          auVar186 = auVar288._0_28_;
          fVar230 = (fVar207 * (float)local_6a0._0_4_ + local_6c0) * fVar230;
          fVar248 = (fVar221 * (float)local_6a0._4_4_ + fStack_6bc) * fVar248;
          fVar256 = (fVar192 * fStack_698 + fStack_6b8) * fVar256;
          fVar274 = (fVar222 * fStack_694 + fStack_6b4) * fVar274;
          fVar292 = (fVar193 * fStack_690 + fStack_6b0) * fVar292;
          fVar226 = (fVar322 * fStack_68c + fStack_6ac) * fVar226;
          fVar228 = (fVar223 * fStack_688 + fStack_6a8) * fVar228;
          auVar239._0_4_ = local_8c0 + fVar191 * fVar230;
          auVar239._4_4_ = fStack_8bc + fVar251 * fVar248;
          auVar239._8_4_ = fStack_8b8 + fVar225 * fVar256;
          auVar239._12_4_ = fStack_8b4 + fVar261 * fVar274;
          auVar239._16_4_ = fStack_8b0 + fVar280 * fVar292;
          auVar239._20_4_ = fStack_8ac + fVar295 * fVar226;
          auVar239._24_4_ = fStack_8a8 + fVar14 * fVar228;
          auVar239._28_4_ = fStack_8a4 + (float)local_5e0._28_4_;
          auVar63._4_4_ = fStack_57c * fVar221;
          auVar63._0_4_ = local_580 * fVar207;
          auVar63._8_4_ = fStack_578 * fVar192;
          auVar63._12_4_ = fStack_574 * fVar222;
          auVar63._16_4_ = fStack_570 * fVar193;
          auVar63._20_4_ = fStack_56c * fVar322;
          auVar63._24_4_ = fStack_568 * fVar223;
          auVar63._28_4_ = fStack_8a4;
          _local_820 = vsubps_avx(auVar63,auVar239);
          auVar240._0_4_ = fVar115 + fVar173 * fVar230;
          auVar240._4_4_ = fVar136 + fVar243 * fVar248;
          auVar240._8_4_ = fVar138 + fVar249 * fVar256;
          auVar240._12_4_ = fVar141 + fVar258 * fVar274;
          auVar240._16_4_ = fVar142 + fVar276 * fVar292;
          auVar240._20_4_ = fVar143 + fVar293 * fVar226;
          auVar240._24_4_ = fVar144 + fVar12 * fVar228;
          auVar240._28_4_ = fVar145 + local_820._28_4_;
          auVar64._4_4_ = fStack_55c * fVar221;
          auVar64._0_4_ = local_560 * fVar207;
          auVar64._8_4_ = fStack_558 * fVar192;
          auVar64._12_4_ = fStack_554 * fVar222;
          auVar64._16_4_ = fStack_550 * fVar193;
          auVar64._20_4_ = fStack_54c * fVar322;
          auVar64._24_4_ = fStack_548 * fVar223;
          auVar64._28_4_ = fStack_8a4;
          _local_840 = vsubps_avx(auVar64,auVar240);
          auVar216._0_4_ = local_8a0 + fVar220 * fVar230;
          auVar216._4_4_ = fStack_89c + fVar247 * fVar248;
          auVar216._8_4_ = fStack_898 + fVar224 * fVar256;
          auVar216._12_4_ = aStack_894.w + fVar259 * fVar274;
          auVar216._16_4_ = fStack_890 + fVar278 * fVar292;
          auVar216._20_4_ = fStack_88c + fVar294 * fVar226;
          auVar216._24_4_ = fStack_888 + fVar13 * fVar228;
          auVar216._28_4_ = fStack_884 + fStack_6a4 + 0.0;
          auVar65._4_4_ = fVar221 * fStack_7dc;
          auVar65._0_4_ = fVar207 * local_7e0;
          auVar65._8_4_ = fVar192 * fStack_7d8;
          auVar65._12_4_ = fVar222 * fStack_7d4;
          auVar65._16_4_ = fVar193 * fStack_7d0;
          auVar65._20_4_ = fVar322 * fStack_7cc;
          auVar65._24_4_ = fVar223 * fStack_7c8;
          auVar65._28_4_ = local_840._28_4_;
          _local_680 = vsubps_avx(auVar65,auVar216);
          auVar288 = vcmpps_avx(auVar20,_DAT_01faff00,5);
          auVar217._8_4_ = 0x7f800000;
          auVar217._0_8_ = 0x7f8000007f800000;
          auVar217._12_4_ = 0x7f800000;
          auVar217._16_4_ = 0x7f800000;
          auVar217._20_4_ = 0x7f800000;
          auVar217._24_4_ = 0x7f800000;
          auVar217._28_4_ = 0x7f800000;
          auVar214 = vblendvps_avx(auVar217,auVar59,auVar288);
          auVar319._8_4_ = 0x7fffffff;
          auVar319._0_8_ = 0x7fffffff7fffffff;
          auVar319._12_4_ = 0x7fffffff;
          auVar319._16_4_ = 0x7fffffff;
          auVar319._20_4_ = 0x7fffffff;
          auVar319._24_4_ = 0x7fffffff;
          auVar319._28_4_ = 0x7fffffff;
          auVar20 = vandps_avx(auVar319,_local_600);
          auVar20 = vmaxps_avx(local_440,auVar20);
          auVar66._4_4_ = auVar20._4_4_ * 1.9073486e-06;
          auVar66._0_4_ = auVar20._0_4_ * 1.9073486e-06;
          auVar66._8_4_ = auVar20._8_4_ * 1.9073486e-06;
          auVar66._12_4_ = auVar20._12_4_ * 1.9073486e-06;
          auVar66._16_4_ = auVar20._16_4_ * 1.9073486e-06;
          auVar66._20_4_ = auVar20._20_4_ * 1.9073486e-06;
          auVar66._24_4_ = auVar20._24_4_ * 1.9073486e-06;
          auVar66._28_4_ = auVar20._28_4_;
          auVar20 = vandps_avx(auVar319,local_480);
          _local_800 = vcmpps_avx(auVar20,auVar66,1);
          auVar241._8_4_ = 0xff800000;
          auVar241._0_8_ = 0xff800000ff800000;
          auVar241._12_4_ = 0xff800000;
          auVar241._16_4_ = 0xff800000;
          auVar241._20_4_ = 0xff800000;
          auVar241._24_4_ = 0xff800000;
          auVar241._28_4_ = 0xff800000;
          auVar238 = vblendvps_avx(auVar241,auVar60,auVar288);
          auVar20 = auVar288 & _local_800;
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar20 >> 0x7f,0) != '\0') ||
                (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0xbf,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar20[0x1f] < '\0') {
            auVar98 = vandps_avx(_local_800,auVar288);
            auVar96 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar20 = vcmpps_avx(auVar19,ZEXT832(0) << 0x20,2);
            auVar360._8_4_ = 0xff800000;
            auVar360._0_8_ = 0xff800000ff800000;
            auVar360._12_4_ = 0xff800000;
            auVar360._16_4_ = 0xff800000;
            auVar360._20_4_ = 0xff800000;
            auVar360._24_4_ = 0xff800000;
            auVar360._28_4_ = 0xff800000;
            auVar351._8_4_ = 0x7f800000;
            auVar351._0_8_ = 0x7f8000007f800000;
            auVar351._12_4_ = 0x7f800000;
            auVar351._16_4_ = 0x7f800000;
            auVar351._20_4_ = 0x7f800000;
            auVar351._24_4_ = 0x7f800000;
            auVar351._28_4_ = 0x7f800000;
            auVar19 = vblendvps_avx(auVar351,auVar360,auVar20);
            auVar90 = vpmovsxwd_avx(auVar96);
            auVar96 = vpunpckhwd_avx(auVar96,auVar96);
            auVar320._16_16_ = auVar96;
            auVar320._0_16_ = auVar90;
            auVar214 = vblendvps_avx(auVar214,auVar19,auVar320);
            auVar19 = vblendvps_avx(auVar360,auVar351,auVar20);
            auVar238 = vblendvps_avx(auVar238,auVar19,auVar320);
            _local_800 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar107._0_4_ = local_800._0_4_ ^ auVar98._0_4_;
            auVar107._4_4_ = local_800._4_4_ ^ auVar98._4_4_;
            auVar107._8_4_ = local_800._8_4_ ^ auVar98._8_4_;
            auVar107._12_4_ = local_800._12_4_ ^ auVar98._12_4_;
            auVar107._16_4_ = local_800._16_4_ ^ auVar98._16_4_;
            auVar107._20_4_ = local_800._20_4_ ^ auVar98._20_4_;
            auVar107._24_4_ = local_800._24_4_ ^ auVar98._24_4_;
            auVar107._28_4_ = local_800._28_4_ ^ auVar98._28_4_;
            auVar98 = vorps_avx(auVar20,auVar107);
            auVar98 = vandps_avx(auVar288,auVar98);
          }
          auVar347 = auVar22._0_28_;
        }
        auVar321 = ZEXT3264(_local_800);
        auVar338 = ZEXT3264(auVar97);
        local_6c0 = (ray->super_RayK<1>).dir.field_0.m128[0];
        fVar207 = (ray->super_RayK<1>).dir.field_0.m128[1];
        local_5c0._4_4_ = fVar207;
        local_5c0._0_4_ = fVar207;
        fStack_5b8 = fVar207;
        fStack_5b4 = fVar207;
        fStack_5b0 = fVar207;
        fStack_5ac = fVar207;
        fStack_5a8 = fVar207;
        fStack_5a4 = fVar207;
        auVar301 = ZEXT3264(_local_5c0);
        fVar173 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_600._4_4_ = fVar173;
        local_600._0_4_ = fVar173;
        fStack_5f8 = fVar173;
        fStack_5f4 = fVar173;
        fStack_5f0 = fVar173;
        fStack_5ec = fVar173;
        fStack_5e8 = fVar173;
        fStack_5e4 = fVar173;
        auVar326 = ZEXT3264(_local_600);
        local_4c0 = _local_8e0;
        local_4a0 = vminps_avx(local_4e0,auVar214);
        _local_500 = vmaxps_avx(_local_8e0,auVar238);
        auVar242 = ZEXT3264(_local_500);
        auVar19 = vcmpps_avx(_local_8e0,local_4a0,2);
        local_5a0 = vandps_avx(auVar97,auVar19);
        auVar19 = vcmpps_avx(_local_500,local_4e0,2);
        local_5e0 = vandps_avx(auVar97,auVar19);
        auVar270 = ZEXT3264(local_5e0);
        auVar97 = vorps_avx(local_5e0,local_5a0);
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0xbf,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar97[0x1f] < '\0') {
          local_6e0 = _local_500;
          auVar97 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_620._0_4_ = auVar98._0_4_ ^ auVar97._0_4_;
          local_620._4_4_ = auVar98._4_4_ ^ auVar97._4_4_;
          local_620._8_4_ = auVar98._8_4_ ^ auVar97._8_4_;
          local_620._12_4_ = auVar98._12_4_ ^ auVar97._12_4_;
          local_620._16_4_ = auVar98._16_4_ ^ auVar97._16_4_;
          local_620._20_4_ = auVar98._20_4_ ^ auVar97._20_4_;
          local_620._24_4_ = auVar98._24_4_ ^ auVar97._24_4_;
          local_620._28_4_ = (uint)auVar98._28_4_ ^ auVar97._28_4_;
          fStack_6bc = local_6c0;
          fStack_6b8 = local_6c0;
          fStack_6b4 = local_6c0;
          fStack_6b0 = local_6c0;
          fStack_6ac = local_6c0;
          fStack_6a8 = local_6c0;
          fStack_6a4 = local_6c0;
          auVar101._0_4_ =
               auVar160._0_4_ * local_6c0 + auVar347._0_4_ * fVar207 + fVar173 * auVar186._0_4_;
          auVar101._4_4_ =
               auVar160._4_4_ * local_6c0 + auVar347._4_4_ * fVar207 + fVar173 * auVar186._4_4_;
          auVar101._8_4_ =
               auVar160._8_4_ * local_6c0 + auVar347._8_4_ * fVar207 + fVar173 * auVar186._8_4_;
          auVar101._12_4_ =
               auVar160._12_4_ * local_6c0 + auVar347._12_4_ * fVar207 + fVar173 * auVar186._12_4_;
          auVar101._16_4_ =
               auVar160._16_4_ * local_6c0 + auVar347._16_4_ * fVar207 + fVar173 * auVar186._16_4_;
          auVar101._20_4_ =
               auVar160._20_4_ * local_6c0 + auVar347._20_4_ * fVar207 + fVar173 * auVar186._20_4_;
          auVar101._24_4_ =
               auVar160._24_4_ * local_6c0 + auVar347._24_4_ * fVar207 + fVar173 * auVar186._24_4_;
          auVar101._28_4_ = auVar98._28_4_ + local_6c0 + auVar160._28_4_;
          auVar129._8_4_ = 0x7fffffff;
          auVar129._0_8_ = 0x7fffffff7fffffff;
          auVar129._12_4_ = 0x7fffffff;
          auVar129._16_4_ = 0x7fffffff;
          auVar129._20_4_ = 0x7fffffff;
          auVar129._24_4_ = 0x7fffffff;
          auVar129._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar101,auVar129);
          auVar130._8_4_ = 0x3e99999a;
          auVar130._0_8_ = 0x3e99999a3e99999a;
          auVar130._12_4_ = 0x3e99999a;
          auVar130._16_4_ = 0x3e99999a;
          auVar130._20_4_ = 0x3e99999a;
          auVar130._24_4_ = 0x3e99999a;
          auVar130._28_4_ = 0x3e99999a;
          auVar97 = vcmpps_avx(auVar97,auVar130,1);
          auVar97 = vorps_avx(auVar97,local_620);
          auVar131._8_4_ = 3;
          auVar131._0_8_ = 0x300000003;
          auVar131._12_4_ = 3;
          auVar131._16_4_ = 3;
          auVar131._20_4_ = 3;
          auVar131._24_4_ = 3;
          auVar131._28_4_ = 3;
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar163,auVar131,auVar97);
          _local_640 = ZEXT432(local_aec);
          auVar90 = vpshufd_avx(ZEXT416(local_aec),0);
          auVar96 = vpcmpgtd_avx(auVar97._16_16_,auVar90);
          local_660 = auVar90._0_4_;
          fStack_65c = auVar90._4_4_;
          fStack_658 = auVar90._8_4_;
          fStack_654 = auVar90._12_4_;
          auVar90 = vpcmpgtd_avx(auVar97._0_16_,auVar90);
          auVar132._16_16_ = auVar96;
          auVar132._0_16_ = auVar90;
          _local_6a0 = vblendps_avx(ZEXT1632(auVar90),auVar132,0xf0);
          local_540 = vandnps_avx(_local_6a0,local_5a0);
          auVar97 = local_5a0 & ~_local_6a0;
          local_780 = auVar23;
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0x7f,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0xbf,0) == '\0') &&
              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar97[0x1f]) {
            fVar207 = (ray->super_RayK<1>).tfar;
            auVar102._4_4_ = fVar207;
            auVar102._0_4_ = fVar207;
            auVar102._8_4_ = fVar207;
            auVar102._12_4_ = fVar207;
            auVar102._16_4_ = fVar207;
            auVar102._20_4_ = fVar207;
            auVar102._24_4_ = fVar207;
            auVar102._28_4_ = fVar207;
            local_920 = (float)uVar79;
          }
          else {
            local_920 = (float)uVar79;
            local_800._4_4_ = (float)local_8e0._4_4_ + (float)local_720._4_4_;
            local_800._0_4_ = (float)local_8e0._0_4_ + (float)local_720._0_4_;
            fStack_7f8 = fStack_8d8 + fStack_718;
            fStack_7f4 = fStack_8d4 + fStack_714;
            fStack_7f0 = fStack_8d0 + fStack_710;
            fStack_7ec = fStack_8cc + fStack_70c;
            fStack_7e8 = fStack_8c8 + fStack_708;
            fStack_7e4 = fStack_8c4 + fStack_704;
            _local_8e0 = auVar21;
            do {
              auVar103._8_4_ = 0x7f800000;
              auVar103._0_8_ = 0x7f8000007f800000;
              auVar103._12_4_ = 0x7f800000;
              auVar103._16_4_ = 0x7f800000;
              auVar103._20_4_ = 0x7f800000;
              auVar103._24_4_ = 0x7f800000;
              auVar103._28_4_ = 0x7f800000;
              auVar97 = vblendvps_avx(auVar103,_local_8e0,local_540);
              auVar98 = vshufps_avx(auVar97,auVar97,0xb1);
              auVar98 = vminps_avx(auVar97,auVar98);
              auVar19 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar19);
              auVar19 = vperm2f128_avx(auVar98,auVar98,1);
              auVar98 = vminps_avx(auVar98,auVar19);
              auVar98 = vcmpps_avx(auVar97,auVar98,0);
              auVar19 = local_540 & auVar98;
              auVar97 = local_540;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar97 = vandps_avx(auVar98,local_540);
              }
              uVar80 = vmovmskps_avx(auVar97);
              uVar79 = 0;
              if (uVar80 != 0) {
                for (; (uVar80 >> uVar79 & 1) == 0; uVar79 = uVar79 + 1) {
                }
              }
              uVar77 = (ulong)uVar79;
              *(undefined4 *)(local_540 + uVar77 * 4) = 0;
              aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_8a0 = aVar3.x;
              fStack_89c = aVar3.y;
              fStack_898 = aVar3.z;
              aStack_894 = aVar3.field_3;
              auVar96 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
              fVar207 = local_1a0[uVar77];
              uVar79 = *(uint *)(local_4c0 + uVar77 * 4);
              if (auVar96._0_4_ < 0.0) {
                fVar173 = sqrtf(auVar96._0_4_);
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar173 = auVar96._0_4_;
              }
              auVar90 = vminps_avx(_local_970,_local_990);
              auVar96 = vmaxps_avx(_local_970,_local_990);
              auVar154 = vminps_avx(_local_980,_local_9a0);
              auVar155 = vminps_avx(auVar90,auVar154);
              auVar90 = vmaxps_avx(_local_980,_local_9a0);
              auVar154 = vmaxps_avx(auVar96,auVar90);
              auVar176._8_4_ = 0x7fffffff;
              auVar176._0_8_ = 0x7fffffff7fffffff;
              auVar176._12_4_ = 0x7fffffff;
              auVar96 = vandps_avx(auVar155,auVar176);
              auVar90 = vandps_avx(auVar154,auVar176);
              auVar96 = vmaxps_avx(auVar96,auVar90);
              auVar90 = vmovshdup_avx(auVar96);
              auVar90 = vmaxss_avx(auVar90,auVar96);
              auVar96 = vshufpd_avx(auVar96,auVar96,1);
              auVar96 = vmaxss_avx(auVar96,auVar90);
              local_8c0 = auVar96._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar173 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar154,auVar154,0xff);
              auVar96 = vinsertps_avx(ZEXT416(uVar79),ZEXT416((uint)fVar207),0x10);
              auVar301 = ZEXT1664(auVar96);
              lVar76 = 5;
              do {
                auVar299 = auVar301._0_16_;
                auVar90 = vmovshdup_avx(auVar299);
                fVar207 = auVar90._0_4_;
                fVar222 = 1.0 - fVar207;
                fVar173 = fVar222 * fVar222;
                fVar220 = fVar222 * fVar173;
                fVar191 = fVar207 * fVar207;
                fVar221 = fVar207 * fVar191;
                fVar192 = fVar207 * fVar222;
                auVar96 = vshufps_avx(ZEXT416((uint)(fVar221 * 0.16666667)),
                                      ZEXT416((uint)(fVar221 * 0.16666667)),0);
                auVar154 = ZEXT416((uint)((fVar221 * 4.0 + fVar220 +
                                          fVar207 * fVar192 * 12.0 + fVar222 * fVar192 * 6.0) *
                                         0.16666667));
                auVar154 = vshufps_avx(auVar154,auVar154,0);
                auVar155 = ZEXT416((uint)((fVar220 * 4.0 + fVar221 +
                                          fVar222 * fVar192 * 12.0 + fVar207 * fVar192 * 6.0) *
                                         0.16666667));
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                auVar92 = vshufps_avx(auVar299,auVar299,0);
                auVar151._0_4_ = auVar92._0_4_ * local_8a0 + 0.0;
                auVar151._4_4_ = auVar92._4_4_ * fStack_89c + 0.0;
                auVar151._8_4_ = auVar92._8_4_ * fStack_898 + 0.0;
                auVar151._12_4_ = auVar92._12_4_ * aStack_894.w + 0.0;
                auVar92 = vshufps_avx(ZEXT416((uint)(fVar220 * 0.16666667)),
                                      ZEXT416((uint)(fVar220 * 0.16666667)),0);
                auVar87._0_4_ =
                     auVar92._0_4_ * (float)local_970._0_4_ +
                     auVar155._0_4_ * (float)local_990._0_4_ +
                     auVar96._0_4_ * (float)local_9a0._0_4_ +
                     auVar154._0_4_ * (float)local_980._0_4_;
                auVar87._4_4_ =
                     auVar92._4_4_ * (float)local_970._4_4_ +
                     auVar155._4_4_ * (float)local_990._4_4_ +
                     auVar96._4_4_ * (float)local_9a0._4_4_ +
                     auVar154._4_4_ * (float)local_980._4_4_;
                auVar87._8_4_ =
                     auVar92._8_4_ * fStack_968 +
                     auVar155._8_4_ * fStack_988 +
                     auVar96._8_4_ * fStack_998 + auVar154._8_4_ * fStack_978;
                auVar87._12_4_ =
                     auVar92._12_4_ * fStack_964 +
                     auVar155._12_4_ * fStack_984 +
                     auVar96._12_4_ * fStack_994 + auVar154._12_4_ * fStack_974;
                local_880._0_16_ = auVar87;
                auVar154 = vsubps_avx(auVar151,auVar87);
                auVar96 = vdpps_avx(auVar154,auVar154,0x7f);
                fVar220 = auVar96._0_4_;
                local_ae0 = auVar301._0_4_;
                if (fVar220 < 0.0) {
                  local_9c0._0_16_ = auVar90;
                  local_9e0._0_4_ = fVar191;
                  local_a00._0_4_ = fVar173;
                  local_a20._0_4_ = fVar192;
                  auVar321._0_4_ = sqrtf(fVar220);
                  auVar321._4_60_ = extraout_var;
                  auVar90 = auVar321._0_16_;
                  fVar191 = (float)local_9e0._0_4_;
                  fVar192 = (float)local_a20._0_4_;
                  fVar207 = (float)local_9c0._0_4_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar96,auVar96);
                  local_a00._0_4_ = fVar173;
                }
                auVar321 = ZEXT1664(auVar90);
                auVar155 = vshufps_avx(ZEXT416((uint)(fVar191 * 0.5)),ZEXT416((uint)(fVar191 * 0.5))
                                       ,0);
                auVar270 = ZEXT1664(_local_9a0);
                auVar92 = ZEXT416((uint)(((float)local_a00._0_4_ + fVar192 * 4.0) * 0.5));
                auVar92 = vshufps_avx(auVar92,auVar92,0);
                auVar85 = ZEXT416((uint)((fVar207 * -fVar207 - fVar192 * 4.0) * 0.5));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar91 = ZEXT416((uint)(fVar222 * -fVar222 * 0.5));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar284._0_4_ =
                     (float)local_970._0_4_ * auVar91._0_4_ +
                     (float)local_990._0_4_ * auVar85._0_4_ +
                     local_9a0._0_4_ * auVar155._0_4_ + (float)local_980._0_4_ * auVar92._0_4_;
                auVar284._4_4_ =
                     (float)local_970._4_4_ * auVar91._4_4_ +
                     (float)local_990._4_4_ * auVar85._4_4_ +
                     local_9a0._4_4_ * auVar155._4_4_ + (float)local_980._4_4_ * auVar92._4_4_;
                auVar284._8_4_ =
                     fStack_968 * auVar91._8_4_ +
                     fStack_988 * auVar85._8_4_ +
                     local_9a0._8_4_ * auVar155._8_4_ + fStack_978 * auVar92._8_4_;
                auVar284._12_4_ =
                     fStack_964 * auVar91._12_4_ +
                     fStack_984 * auVar85._12_4_ +
                     local_9a0._12_4_ * auVar155._12_4_ + fStack_974 * auVar92._12_4_;
                auVar155 = vshufps_avx(auVar299,auVar299,0x55);
                auVar92 = ZEXT416((uint)(fVar222 - (fVar207 + fVar207)));
                auVar85 = vshufps_avx(auVar92,auVar92,0);
                auVar92 = ZEXT416((uint)(fVar207 - (fVar222 + fVar222)));
                auVar91 = vshufps_avx(auVar92,auVar92,0);
                auVar117 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                auVar92 = vdpps_avx(auVar284,auVar284,0x7f);
                auVar119._0_4_ =
                     (float)local_970._0_4_ * auVar117._0_4_ +
                     (float)local_990._0_4_ * auVar91._0_4_ +
                     local_9a0._0_4_ * auVar155._0_4_ + (float)local_980._0_4_ * auVar85._0_4_;
                auVar119._4_4_ =
                     (float)local_970._4_4_ * auVar117._4_4_ +
                     (float)local_990._4_4_ * auVar91._4_4_ +
                     local_9a0._4_4_ * auVar155._4_4_ + (float)local_980._4_4_ * auVar85._4_4_;
                auVar119._8_4_ =
                     fStack_968 * auVar117._8_4_ +
                     fStack_988 * auVar91._8_4_ +
                     local_9a0._8_4_ * auVar155._8_4_ + fStack_978 * auVar85._8_4_;
                auVar119._12_4_ =
                     fStack_964 * auVar117._12_4_ +
                     fStack_984 * auVar91._12_4_ +
                     local_9a0._12_4_ * auVar155._12_4_ + fStack_974 * auVar85._12_4_;
                auVar155 = vblendps_avx(auVar92,_DAT_01f7aa10,0xe);
                auVar85 = vrsqrtss_avx(auVar155,auVar155);
                fVar173 = auVar85._0_4_;
                fVar207 = auVar92._0_4_;
                auVar85 = vdpps_avx(auVar284,auVar119,0x7f);
                auVar91 = vshufps_avx(auVar92,auVar92,0);
                auVar120._0_4_ = auVar119._0_4_ * auVar91._0_4_;
                auVar120._4_4_ = auVar119._4_4_ * auVar91._4_4_;
                auVar120._8_4_ = auVar119._8_4_ * auVar91._8_4_;
                auVar120._12_4_ = auVar119._12_4_ * auVar91._12_4_;
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar196._0_4_ = auVar284._0_4_ * auVar85._0_4_;
                auVar196._4_4_ = auVar284._4_4_ * auVar85._4_4_;
                auVar196._8_4_ = auVar284._8_4_ * auVar85._8_4_;
                auVar196._12_4_ = auVar284._12_4_ * auVar85._12_4_;
                auVar117 = vsubps_avx(auVar120,auVar196);
                auVar85 = vrcpss_avx(auVar155,auVar155);
                auVar155 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                      ZEXT416((uint)(local_ae0 * (float)local_740._0_4_)));
                auVar338 = ZEXT1664(auVar155);
                auVar85 = ZEXT416((uint)(auVar85._0_4_ * (2.0 - fVar207 * auVar85._0_4_)));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                uVar77 = CONCAT44(auVar284._4_4_,auVar284._0_4_);
                local_a00._0_8_ = uVar77 ^ 0x8000000080000000;
                local_a00._8_4_ = -auVar284._8_4_;
                local_a00._12_4_ = -auVar284._12_4_;
                auVar91 = ZEXT416((uint)(fVar173 * 1.5 +
                                        fVar207 * -0.5 * fVar173 * fVar173 * fVar173));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar177._0_4_ = auVar91._0_4_ * auVar117._0_4_ * auVar85._0_4_;
                auVar177._4_4_ = auVar91._4_4_ * auVar117._4_4_ * auVar85._4_4_;
                auVar177._8_4_ = auVar91._8_4_ * auVar117._8_4_ * auVar85._8_4_;
                auVar177._12_4_ = auVar91._12_4_ * auVar117._12_4_ * auVar85._12_4_;
                auVar234._0_4_ = auVar284._0_4_ * auVar91._0_4_;
                auVar234._4_4_ = auVar284._4_4_ * auVar91._4_4_;
                auVar234._8_4_ = auVar284._8_4_ * auVar91._8_4_;
                auVar234._12_4_ = auVar284._12_4_ * auVar91._12_4_;
                local_9c0._0_4_ = auVar155._0_4_;
                if (fVar207 < 0.0) {
                  local_9e0._0_4_ = auVar90._0_4_;
                  local_a20._0_16_ = auVar234;
                  local_900._0_16_ = auVar177;
                  auVar270 = ZEXT1664(_local_9a0);
                  fVar207 = sqrtf(fVar207);
                  auVar321 = ZEXT464((uint)local_9e0._0_4_);
                  auVar338 = ZEXT464((uint)local_9c0._0_4_);
                  auVar177 = local_900._0_16_;
                  auVar234 = local_a20._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar92,auVar92);
                  fVar207 = auVar90._0_4_;
                }
                auVar90 = vdpps_avx(auVar154,auVar234,0x7f);
                local_9e0._0_4_ =
                     (local_8c0 / fVar207) * (auVar321._0_4_ + 1.0) +
                     auVar338._0_4_ + auVar321._0_4_ * local_8c0;
                auVar155 = vdpps_avx(local_a00._0_16_,auVar234,0x7f);
                auVar92 = vdpps_avx(auVar154,auVar177,0x7f);
                auVar71._4_4_ = fStack_89c;
                auVar71._0_4_ = local_8a0;
                auVar71._8_4_ = fStack_898;
                auVar71._12_4_ = aStack_894.a;
                auVar85 = vdpps_avx(auVar71,auVar234,0x7f);
                auVar91 = vdpps_avx(auVar154,local_a00._0_16_,0x7f);
                fVar207 = auVar155._0_4_ + auVar92._0_4_;
                fVar173 = auVar90._0_4_;
                auVar88._0_4_ = fVar173 * fVar173;
                auVar88._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar88._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar88._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar92 = vsubps_avx(auVar96,auVar88);
                local_a00._0_16_ = ZEXT416((uint)fVar207);
                auVar155 = vdpps_avx(auVar154,auVar71,0x7f);
                fVar191 = auVar91._0_4_ - fVar173 * fVar207;
                fVar173 = auVar155._0_4_ - fVar173 * auVar85._0_4_;
                auVar155 = vrsqrtss_avx(auVar92,auVar92);
                fVar221 = auVar92._0_4_;
                fVar207 = auVar155._0_4_;
                fVar207 = fVar207 * 1.5 + fVar221 * -0.5 * fVar207 * fVar207 * fVar207;
                if (fVar221 < 0.0) {
                  local_a20._0_16_ = auVar90;
                  local_900._0_16_ = auVar85;
                  local_760._0_4_ = fVar191;
                  local_780._0_4_ = fVar173;
                  local_7a0._0_4_ = fVar207;
                  auVar270 = ZEXT1664(auVar270._0_16_);
                  auVar321 = ZEXT1664(auVar321._0_16_);
                  fVar221 = sqrtf(fVar221);
                  auVar338 = ZEXT464((uint)local_9c0._0_4_);
                  fVar207 = (float)local_7a0._0_4_;
                  fVar191 = (float)local_760._0_4_;
                  fVar173 = (float)local_780._0_4_;
                  auVar85 = local_900._0_16_;
                  auVar90 = local_a20._0_16_;
                }
                else {
                  auVar155 = vsqrtss_avx(auVar92,auVar92);
                  fVar221 = auVar155._0_4_;
                }
                auVar326 = ZEXT1664(auVar284);
                auVar91 = vpermilps_avx(local_880._0_16_,0xff);
                auVar117 = vshufps_avx(auVar284,auVar284,0xff);
                fVar192 = fVar191 * fVar207 - auVar117._0_4_;
                auVar197._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                auVar197._8_4_ = auVar85._8_4_ ^ 0x80000000;
                auVar197._12_4_ = auVar85._12_4_ ^ 0x80000000;
                auVar210._0_4_ = -fVar192;
                auVar210._4_4_ = 0x80000000;
                auVar210._8_4_ = 0x80000000;
                auVar210._12_4_ = 0x80000000;
                fVar191 = local_a00._0_4_ * fVar173 * fVar207;
                auVar242 = ZEXT464((uint)fVar191);
                auVar155 = vinsertps_avx(auVar210,ZEXT416((uint)(fVar173 * fVar207)),0x1c);
                auVar85 = vmovsldup_avx(ZEXT416((uint)(fVar191 - auVar85._0_4_ * fVar192)));
                auVar155 = vdivps_avx(auVar155,auVar85);
                auVar92 = vinsertps_avx(local_a00._0_16_,auVar197,0x10);
                auVar92 = vdivps_avx(auVar92,auVar85);
                auVar85 = vmovsldup_avx(auVar90);
                auVar94 = ZEXT416((uint)(fVar221 - auVar91._0_4_));
                auVar91 = vmovsldup_avx(auVar94);
                auVar152._0_4_ = auVar85._0_4_ * auVar155._0_4_ + auVar91._0_4_ * auVar92._0_4_;
                auVar152._4_4_ = auVar85._4_4_ * auVar155._4_4_ + auVar91._4_4_ * auVar92._4_4_;
                auVar152._8_4_ = auVar85._8_4_ * auVar155._8_4_ + auVar91._8_4_ * auVar92._8_4_;
                auVar152._12_4_ = auVar85._12_4_ * auVar155._12_4_ + auVar91._12_4_ * auVar92._12_4_
                ;
                auVar155 = vsubps_avx(auVar299,auVar152);
                auVar301 = ZEXT1664(auVar155);
                auVar153._8_4_ = 0x7fffffff;
                auVar153._0_8_ = 0x7fffffff7fffffff;
                auVar153._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx(auVar90,auVar153);
                if (auVar90._0_4_ < (float)local_9e0._0_4_) {
                  auVar178._8_4_ = 0x7fffffff;
                  auVar178._0_8_ = 0x7fffffff7fffffff;
                  auVar178._12_4_ = 0x7fffffff;
                  auVar90 = vandps_avx(auVar94,auVar178);
                  if (auVar90._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 +
                      auVar338._0_4_ + (float)local_9e0._0_4_) {
                    fVar207 = auVar155._0_4_ + (float)local_850._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar207) {
                      fVar173 = (ray->super_RayK<1>).tfar;
                      auVar242 = ZEXT464((uint)fVar173);
                      if (fVar207 <= fVar173) {
                        auVar90 = vmovshdup_avx(auVar155);
                        fVar191 = auVar90._0_4_;
                        if ((0.0 <= fVar191) && (fVar191 <= 1.0)) {
                          auVar96 = vrsqrtss_avx(auVar96,auVar96);
                          fVar221 = auVar96._0_4_;
                          pGVar7 = (context->scene->geometries).items[uVar6].ptr;
                          if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar96 = ZEXT416((uint)(fVar221 * 1.5 +
                                                    fVar220 * -0.5 * fVar221 * fVar221 * fVar221));
                            auVar96 = vshufps_avx(auVar96,auVar96,0);
                            local_a80 = auVar154._0_4_;
                            fStack_a7c = auVar154._4_4_;
                            fStack_a78 = auVar154._8_4_;
                            fStack_a74 = auVar154._12_4_;
                            auVar179._0_4_ = auVar96._0_4_ * local_a80;
                            auVar179._4_4_ = auVar96._4_4_ * fStack_a7c;
                            auVar179._8_4_ = auVar96._8_4_ * fStack_a78;
                            auVar179._12_4_ = auVar96._12_4_ * fStack_a74;
                            auVar121._0_4_ = auVar284._0_4_ + auVar117._0_4_ * auVar179._0_4_;
                            auVar121._4_4_ = auVar284._4_4_ + auVar117._4_4_ * auVar179._4_4_;
                            auVar121._8_4_ = auVar284._8_4_ + auVar117._8_4_ * auVar179._8_4_;
                            auVar121._12_4_ = auVar284._12_4_ + auVar117._12_4_ * auVar179._12_4_;
                            auVar96 = vshufps_avx(auVar179,auVar179,0xc9);
                            auVar90 = vshufps_avx(auVar284,auVar284,0xc9);
                            auVar180._0_4_ = auVar90._0_4_ * auVar179._0_4_;
                            auVar180._4_4_ = auVar90._4_4_ * auVar179._4_4_;
                            auVar180._8_4_ = auVar90._8_4_ * auVar179._8_4_;
                            auVar180._12_4_ = auVar90._12_4_ * auVar179._12_4_;
                            auVar198._0_4_ = auVar284._0_4_ * auVar96._0_4_;
                            auVar198._4_4_ = auVar284._4_4_ * auVar96._4_4_;
                            auVar198._8_4_ = auVar284._8_4_ * auVar96._8_4_;
                            auVar198._12_4_ = auVar284._12_4_ * auVar96._12_4_;
                            auVar154 = vsubps_avx(auVar198,auVar180);
                            auVar96 = vshufps_avx(auVar154,auVar154,0xc9);
                            auVar90 = vshufps_avx(auVar121,auVar121,0xc9);
                            auVar199._0_4_ = auVar90._0_4_ * auVar96._0_4_;
                            auVar199._4_4_ = auVar90._4_4_ * auVar96._4_4_;
                            auVar199._8_4_ = auVar90._8_4_ * auVar96._8_4_;
                            auVar199._12_4_ = auVar90._12_4_ * auVar96._12_4_;
                            auVar96 = vshufps_avx(auVar154,auVar154,0xd2);
                            auVar122._0_4_ = auVar121._0_4_ * auVar96._0_4_;
                            auVar122._4_4_ = auVar121._4_4_ * auVar96._4_4_;
                            auVar122._8_4_ = auVar121._8_4_ * auVar96._8_4_;
                            auVar122._12_4_ = auVar121._12_4_ * auVar96._12_4_;
                            auVar96 = vsubps_avx(auVar199,auVar122);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar207;
                              auVar90 = vshufps_avx(auVar96,auVar96,0xe9);
                              uVar2 = vmovlps_avx(auVar90);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                              (ray->Ng).field_0.field_0.z = auVar96._0_4_;
                              ray->u = fVar191;
                              ray->v = 0.0;
                              ray->primID = (uint)local_920;
                              ray->geomID = uVar6;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar90 = vshufps_avx(auVar96,auVar96,0xe9);
                              local_960 = vmovlps_avx(auVar90);
                              local_958 = auVar96._0_4_;
                              local_954 = fVar191;
                              local_950 = 0;
                              local_94c = (uint)local_920;
                              local_948 = uVar6;
                              local_944 = context->user->instID[0];
                              local_940 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar207;
                              local_700._0_4_ = 0xffffffff;
                              local_a58.valid = (int *)local_700;
                              local_a58.geometryUserPtr = pGVar7->userPtr;
                              local_a58.context = context->user;
                              local_a58.hit = (RTCHitN *)&local_960;
                              local_a58.N = 1;
                              local_a58.ray = (RTCRayN *)ray;
                              if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e157b1:
                                p_Var8 = context->args->filter;
                                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar242 = ZEXT1664(auVar242._0_16_);
                                  auVar270 = ZEXT1664(auVar270._0_16_);
                                  auVar301 = ZEXT1664(auVar301._0_16_);
                                  auVar321 = ZEXT1664(auVar321._0_16_);
                                  auVar326 = ZEXT1664(auVar326._0_16_);
                                  auVar338 = ZEXT1664(auVar338._0_16_);
                                  (*p_Var8)(&local_a58);
                                  if (*local_a58.valid == 0) goto LAB_00e15846;
                                }
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a58.hit;
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a58.hit + 4);
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a58.hit + 8);
                                *(float *)((long)local_a58.ray + 0x3c) =
                                     *(float *)(local_a58.hit + 0xc);
                                *(float *)((long)local_a58.ray + 0x40) =
                                     *(float *)(local_a58.hit + 0x10);
                                *(float *)((long)local_a58.ray + 0x44) =
                                     *(float *)(local_a58.hit + 0x14);
                                *(float *)((long)local_a58.ray + 0x48) =
                                     *(float *)(local_a58.hit + 0x18);
                                *(float *)((long)local_a58.ray + 0x4c) =
                                     *(float *)(local_a58.hit + 0x1c);
                                *(float *)((long)local_a58.ray + 0x50) =
                                     *(float *)(local_a58.hit + 0x20);
                              }
                              else {
                                auVar242 = ZEXT464((uint)fVar173);
                                auVar270 = ZEXT1664(auVar270._0_16_);
                                auVar301 = ZEXT1664(auVar155);
                                auVar321 = ZEXT1664(auVar321._0_16_);
                                auVar326 = ZEXT1664(auVar284);
                                auVar338 = ZEXT1664(auVar338._0_16_);
                                (*pGVar7->intersectionFilterN)(&local_a58);
                                if (*local_a58.valid != 0) goto LAB_00e157b1;
LAB_00e15846:
                                (ray->super_RayK<1>).tfar = fVar173;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              auVar98 = local_540;
              fVar207 = (ray->super_RayK<1>).tfar;
              auVar102._4_4_ = fVar207;
              auVar102._0_4_ = fVar207;
              auVar102._8_4_ = fVar207;
              auVar102._12_4_ = fVar207;
              auVar102._16_4_ = fVar207;
              auVar102._20_4_ = fVar207;
              auVar102._24_4_ = fVar207;
              auVar102._28_4_ = fVar207;
              auVar97 = vcmpps_avx(_local_800,auVar102,2);
              local_540 = vandps_avx(auVar97,local_540);
              auVar98 = auVar98 & auVar97;
            } while ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar98 >> 0x7f,0) != '\0') ||
                       (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar98 >> 0xbf,0) != '\0') ||
                     (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar98[0x1f] < '\0');
          }
          auVar133._0_4_ =
               local_6c0 * (float)local_820._0_4_ +
               (float)local_5c0._0_4_ * (float)local_840._0_4_ +
               (float)local_600._0_4_ * (float)local_680._0_4_;
          auVar133._4_4_ =
               fStack_6bc * (float)local_820._4_4_ +
               (float)local_5c0._4_4_ * (float)local_840._4_4_ +
               (float)local_600._4_4_ * (float)local_680._4_4_;
          auVar133._8_4_ =
               fStack_6b8 * fStack_818 + fStack_5b8 * fStack_838 + fStack_5f8 * fStack_678;
          auVar133._12_4_ =
               fStack_6b4 * fStack_814 + fStack_5b4 * fStack_834 + fStack_5f4 * fStack_674;
          auVar133._16_4_ =
               fStack_6b0 * fStack_810 + fStack_5b0 * fStack_830 + fStack_5f0 * fStack_670;
          auVar133._20_4_ =
               fStack_6ac * fStack_80c + fStack_5ac * fStack_82c + fStack_5ec * fStack_66c;
          auVar133._24_4_ =
               fStack_6a8 * fStack_808 + fStack_5a8 * fStack_828 + fStack_5e8 * fStack_668;
          auVar133._28_4_ = fStack_6a4 + fStack_5a4 + fStack_5e4;
          auVar164._8_4_ = 0x7fffffff;
          auVar164._0_8_ = 0x7fffffff7fffffff;
          auVar164._12_4_ = 0x7fffffff;
          auVar164._16_4_ = 0x7fffffff;
          auVar164._20_4_ = 0x7fffffff;
          auVar164._24_4_ = 0x7fffffff;
          auVar164._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar133,auVar164);
          auVar165._8_4_ = 0x3e99999a;
          auVar165._0_8_ = 0x3e99999a3e99999a;
          auVar165._12_4_ = 0x3e99999a;
          auVar165._16_4_ = 0x3e99999a;
          auVar165._20_4_ = 0x3e99999a;
          auVar165._24_4_ = 0x3e99999a;
          auVar165._28_4_ = 0x3e99999a;
          auVar97 = vcmpps_avx(auVar97,auVar165,1);
          auVar98 = vorps_avx(auVar97,local_620);
          auVar166._0_4_ = (float)local_720._0_4_ + local_6e0._0_4_;
          auVar166._4_4_ = (float)local_720._4_4_ + local_6e0._4_4_;
          auVar166._8_4_ = fStack_718 + local_6e0._8_4_;
          auVar166._12_4_ = fStack_714 + local_6e0._12_4_;
          auVar166._16_4_ = fStack_710 + local_6e0._16_4_;
          auVar166._20_4_ = fStack_70c + local_6e0._20_4_;
          auVar166._24_4_ = fStack_708 + local_6e0._24_4_;
          auVar166._28_4_ = fStack_704 + local_6e0._28_4_;
          auVar97 = vcmpps_avx(auVar166,auVar102,2);
          _local_840 = vandps_avx(auVar97,local_5e0);
          auVar167._8_4_ = 3;
          auVar167._0_8_ = 0x300000003;
          auVar167._12_4_ = 3;
          auVar167._16_4_ = 3;
          auVar167._20_4_ = 3;
          auVar167._24_4_ = 3;
          auVar167._28_4_ = 3;
          auVar190._8_4_ = 2;
          auVar190._0_8_ = 0x200000002;
          auVar190._12_4_ = 2;
          auVar190._16_4_ = 2;
          auVar190._20_4_ = 2;
          auVar190._24_4_ = 2;
          auVar190._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar190,auVar167,auVar98);
          auVar74._4_4_ = fStack_65c;
          auVar74._0_4_ = local_660;
          auVar74._8_4_ = fStack_658;
          auVar74._12_4_ = fStack_654;
          auVar96 = vpcmpgtd_avx(auVar97._16_16_,auVar74);
          auVar90 = vpshufd_avx(_local_640,0);
          auVar90 = vpcmpgtd_avx(auVar97._0_16_,auVar90);
          auVar168._16_16_ = auVar96;
          auVar168._0_16_ = auVar102._0_16_;
          _local_820 = vblendps_avx(ZEXT1632(auVar90),auVar168,0xf0);
          local_700 = vandnps_avx(_local_820,_local_840);
          auVar97 = _local_840 & ~_local_820;
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar97 >> 0x7f,0) != '\0') ||
                (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0xbf,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar97[0x1f] < '\0') {
            local_800._4_4_ = (float)local_720._4_4_ + local_500._4_4_;
            local_800._0_4_ = (float)local_720._0_4_ + local_500._0_4_;
            fStack_7f8 = fStack_718 + local_500._8_4_;
            fStack_7f4 = fStack_714 + local_500._12_4_;
            fStack_7f0 = fStack_710 + local_500._16_4_;
            fStack_7ec = fStack_70c + local_500._20_4_;
            fStack_7e8 = fStack_708 + local_500._24_4_;
            fStack_7e4 = fStack_704 + local_500._28_4_;
            _local_8e0 = _local_500;
            do {
              auVar104._8_4_ = 0x7f800000;
              auVar104._0_8_ = 0x7f8000007f800000;
              auVar104._12_4_ = 0x7f800000;
              auVar104._16_4_ = 0x7f800000;
              auVar104._20_4_ = 0x7f800000;
              auVar104._24_4_ = 0x7f800000;
              auVar104._28_4_ = 0x7f800000;
              auVar97 = vblendvps_avx(auVar104,_local_8e0,local_700);
              auVar98 = vshufps_avx(auVar97,auVar97,0xb1);
              auVar98 = vminps_avx(auVar97,auVar98);
              auVar19 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar19);
              auVar19 = vperm2f128_avx(auVar98,auVar98,1);
              auVar98 = vminps_avx(auVar98,auVar19);
              auVar98 = vcmpps_avx(auVar97,auVar98,0);
              auVar19 = local_700 & auVar98;
              auVar97 = local_700;
              if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0x7f,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0xbf,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar19[0x1f] < '\0') {
                auVar97 = vandps_avx(auVar98,local_700);
              }
              uVar80 = vmovmskps_avx(auVar97);
              uVar79 = 0;
              if (uVar80 != 0) {
                for (; (uVar80 >> uVar79 & 1) == 0; uVar79 = uVar79 + 1) {
                }
              }
              uVar77 = (ulong)uVar79;
              *(undefined4 *)(local_700 + uVar77 * 4) = 0;
              aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
              local_8a0 = aVar3.x;
              fStack_89c = aVar3.y;
              fStack_898 = aVar3.z;
              aStack_894 = aVar3.field_3;
              auVar96 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
              fVar207 = local_1c0[uVar77];
              uVar79 = *(uint *)(local_4e0 + uVar77 * 4);
              if (auVar96._0_4_ < 0.0) {
                fVar173 = sqrtf(auVar96._0_4_);
              }
              else {
                auVar96 = vsqrtss_avx(auVar96,auVar96);
                fVar173 = auVar96._0_4_;
              }
              auVar90 = vminps_avx(_local_970,_local_990);
              auVar96 = vmaxps_avx(_local_970,_local_990);
              auVar154 = vminps_avx(_local_980,_local_9a0);
              auVar155 = vminps_avx(auVar90,auVar154);
              auVar90 = vmaxps_avx(_local_980,_local_9a0);
              auVar154 = vmaxps_avx(auVar96,auVar90);
              auVar181._8_4_ = 0x7fffffff;
              auVar181._0_8_ = 0x7fffffff7fffffff;
              auVar181._12_4_ = 0x7fffffff;
              auVar96 = vandps_avx(auVar155,auVar181);
              auVar90 = vandps_avx(auVar154,auVar181);
              auVar96 = vmaxps_avx(auVar96,auVar90);
              auVar90 = vmovshdup_avx(auVar96);
              auVar90 = vmaxss_avx(auVar90,auVar96);
              auVar96 = vshufpd_avx(auVar96,auVar96,1);
              auVar96 = vmaxss_avx(auVar96,auVar90);
              local_8c0 = auVar96._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar173 * 1.9073486e-06;
              local_7c0._0_16_ = vshufps_avx(auVar154,auVar154,0xff);
              auVar96 = vinsertps_avx(ZEXT416(uVar79),ZEXT416((uint)fVar207),0x10);
              auVar301 = ZEXT1664(auVar96);
              lVar76 = 5;
              do {
                auVar299 = auVar301._0_16_;
                auVar90 = vmovshdup_avx(auVar299);
                fVar207 = auVar90._0_4_;
                fVar222 = 1.0 - fVar207;
                fVar173 = fVar222 * fVar222;
                fVar220 = fVar222 * fVar173;
                fVar191 = fVar207 * fVar207;
                fVar221 = fVar207 * fVar191;
                fVar192 = fVar207 * fVar222;
                auVar96 = vshufps_avx(ZEXT416((uint)(fVar221 * 0.16666667)),
                                      ZEXT416((uint)(fVar221 * 0.16666667)),0);
                auVar154 = ZEXT416((uint)((fVar221 * 4.0 + fVar220 +
                                          fVar207 * fVar192 * 12.0 + fVar222 * fVar192 * 6.0) *
                                         0.16666667));
                auVar154 = vshufps_avx(auVar154,auVar154,0);
                auVar155 = ZEXT416((uint)((fVar220 * 4.0 + fVar221 +
                                          fVar222 * fVar192 * 12.0 + fVar207 * fVar192 * 6.0) *
                                         0.16666667));
                auVar155 = vshufps_avx(auVar155,auVar155,0);
                auVar92 = vshufps_avx(auVar299,auVar299,0);
                auVar156._0_4_ = auVar92._0_4_ * local_8a0 + 0.0;
                auVar156._4_4_ = auVar92._4_4_ * fStack_89c + 0.0;
                auVar156._8_4_ = auVar92._8_4_ * fStack_898 + 0.0;
                auVar156._12_4_ = auVar92._12_4_ * aStack_894.w + 0.0;
                auVar92 = vshufps_avx(ZEXT416((uint)(fVar220 * 0.16666667)),
                                      ZEXT416((uint)(fVar220 * 0.16666667)),0);
                auVar89._0_4_ =
                     auVar92._0_4_ * (float)local_970._0_4_ +
                     auVar155._0_4_ * (float)local_990._0_4_ +
                     auVar96._0_4_ * (float)local_9a0._0_4_ +
                     auVar154._0_4_ * (float)local_980._0_4_;
                auVar89._4_4_ =
                     auVar92._4_4_ * (float)local_970._4_4_ +
                     auVar155._4_4_ * (float)local_990._4_4_ +
                     auVar96._4_4_ * (float)local_9a0._4_4_ +
                     auVar154._4_4_ * (float)local_980._4_4_;
                auVar89._8_4_ =
                     auVar92._8_4_ * fStack_968 +
                     auVar155._8_4_ * fStack_988 +
                     auVar96._8_4_ * fStack_998 + auVar154._8_4_ * fStack_978;
                auVar89._12_4_ =
                     auVar92._12_4_ * fStack_964 +
                     auVar155._12_4_ * fStack_984 +
                     auVar96._12_4_ * fStack_994 + auVar154._12_4_ * fStack_974;
                local_880._0_16_ = auVar89;
                auVar154 = vsubps_avx(auVar156,auVar89);
                auVar96 = vdpps_avx(auVar154,auVar154,0x7f);
                fVar220 = auVar96._0_4_;
                local_ae0 = auVar301._0_4_;
                if (fVar220 < 0.0) {
                  local_9c0._0_16_ = auVar90;
                  local_9e0._0_4_ = fVar191;
                  local_a00._0_4_ = fVar173;
                  local_a20._0_4_ = fVar192;
                  auVar326._0_4_ = sqrtf(fVar220);
                  auVar326._4_60_ = extraout_var_00;
                  auVar90 = auVar326._0_16_;
                  fVar191 = (float)local_9e0._0_4_;
                  fVar192 = (float)local_a20._0_4_;
                  fVar207 = (float)local_9c0._0_4_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar96,auVar96);
                  local_a00._0_4_ = fVar173;
                }
                auVar321 = ZEXT1664(auVar90);
                auVar155 = vshufps_avx(ZEXT416((uint)(fVar191 * 0.5)),ZEXT416((uint)(fVar191 * 0.5))
                                       ,0);
                auVar270 = ZEXT1664(_local_9a0);
                auVar92 = ZEXT416((uint)(((float)local_a00._0_4_ + fVar192 * 4.0) * 0.5));
                auVar92 = vshufps_avx(auVar92,auVar92,0);
                auVar85 = ZEXT416((uint)((fVar207 * -fVar207 - fVar192 * 4.0) * 0.5));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar91 = ZEXT416((uint)(fVar222 * -fVar222 * 0.5));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar285._0_4_ =
                     (float)local_970._0_4_ * auVar91._0_4_ +
                     (float)local_990._0_4_ * auVar85._0_4_ +
                     local_9a0._0_4_ * auVar155._0_4_ + (float)local_980._0_4_ * auVar92._0_4_;
                auVar285._4_4_ =
                     (float)local_970._4_4_ * auVar91._4_4_ +
                     (float)local_990._4_4_ * auVar85._4_4_ +
                     local_9a0._4_4_ * auVar155._4_4_ + (float)local_980._4_4_ * auVar92._4_4_;
                auVar285._8_4_ =
                     fStack_968 * auVar91._8_4_ +
                     fStack_988 * auVar85._8_4_ +
                     local_9a0._8_4_ * auVar155._8_4_ + fStack_978 * auVar92._8_4_;
                auVar285._12_4_ =
                     fStack_964 * auVar91._12_4_ +
                     fStack_984 * auVar85._12_4_ +
                     local_9a0._12_4_ * auVar155._12_4_ + fStack_974 * auVar92._12_4_;
                auVar155 = vshufps_avx(auVar299,auVar299,0x55);
                auVar92 = ZEXT416((uint)(fVar222 - (fVar207 + fVar207)));
                auVar85 = vshufps_avx(auVar92,auVar92,0);
                auVar92 = ZEXT416((uint)(fVar207 - (fVar222 + fVar222)));
                auVar91 = vshufps_avx(auVar92,auVar92,0);
                auVar117 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                auVar92 = vdpps_avx(auVar285,auVar285,0x7f);
                auVar123._0_4_ =
                     (float)local_970._0_4_ * auVar117._0_4_ +
                     (float)local_990._0_4_ * auVar91._0_4_ +
                     local_9a0._0_4_ * auVar155._0_4_ + (float)local_980._0_4_ * auVar85._0_4_;
                auVar123._4_4_ =
                     (float)local_970._4_4_ * auVar117._4_4_ +
                     (float)local_990._4_4_ * auVar91._4_4_ +
                     local_9a0._4_4_ * auVar155._4_4_ + (float)local_980._4_4_ * auVar85._4_4_;
                auVar123._8_4_ =
                     fStack_968 * auVar117._8_4_ +
                     fStack_988 * auVar91._8_4_ +
                     local_9a0._8_4_ * auVar155._8_4_ + fStack_978 * auVar85._8_4_;
                auVar123._12_4_ =
                     fStack_964 * auVar117._12_4_ +
                     fStack_984 * auVar91._12_4_ +
                     local_9a0._12_4_ * auVar155._12_4_ + fStack_974 * auVar85._12_4_;
                auVar155 = vblendps_avx(auVar92,_DAT_01f7aa10,0xe);
                auVar85 = vrsqrtss_avx(auVar155,auVar155);
                fVar173 = auVar85._0_4_;
                fVar207 = auVar92._0_4_;
                auVar85 = vdpps_avx(auVar285,auVar123,0x7f);
                auVar91 = vshufps_avx(auVar92,auVar92,0);
                auVar124._0_4_ = auVar123._0_4_ * auVar91._0_4_;
                auVar124._4_4_ = auVar123._4_4_ * auVar91._4_4_;
                auVar124._8_4_ = auVar123._8_4_ * auVar91._8_4_;
                auVar124._12_4_ = auVar123._12_4_ * auVar91._12_4_;
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar200._0_4_ = auVar285._0_4_ * auVar85._0_4_;
                auVar200._4_4_ = auVar285._4_4_ * auVar85._4_4_;
                auVar200._8_4_ = auVar285._8_4_ * auVar85._8_4_;
                auVar200._12_4_ = auVar285._12_4_ * auVar85._12_4_;
                auVar117 = vsubps_avx(auVar124,auVar200);
                auVar85 = vrcpss_avx(auVar155,auVar155);
                auVar155 = vmaxss_avx(ZEXT416((uint)local_8c0),
                                      ZEXT416((uint)(local_ae0 * (float)local_740._0_4_)));
                auVar338 = ZEXT1664(auVar155);
                auVar85 = ZEXT416((uint)(auVar85._0_4_ * (2.0 - fVar207 * auVar85._0_4_)));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                uVar77 = CONCAT44(auVar285._4_4_,auVar285._0_4_);
                local_a00._0_8_ = uVar77 ^ 0x8000000080000000;
                local_a00._8_4_ = -auVar285._8_4_;
                local_a00._12_4_ = -auVar285._12_4_;
                auVar91 = ZEXT416((uint)(fVar173 * 1.5 +
                                        fVar207 * -0.5 * fVar173 * fVar173 * fVar173));
                auVar91 = vshufps_avx(auVar91,auVar91,0);
                auVar182._0_4_ = auVar91._0_4_ * auVar117._0_4_ * auVar85._0_4_;
                auVar182._4_4_ = auVar91._4_4_ * auVar117._4_4_ * auVar85._4_4_;
                auVar182._8_4_ = auVar91._8_4_ * auVar117._8_4_ * auVar85._8_4_;
                auVar182._12_4_ = auVar91._12_4_ * auVar117._12_4_ * auVar85._12_4_;
                auVar235._0_4_ = auVar285._0_4_ * auVar91._0_4_;
                auVar235._4_4_ = auVar285._4_4_ * auVar91._4_4_;
                auVar235._8_4_ = auVar285._8_4_ * auVar91._8_4_;
                auVar235._12_4_ = auVar285._12_4_ * auVar91._12_4_;
                local_9c0._0_4_ = auVar155._0_4_;
                if (fVar207 < 0.0) {
                  local_9e0._0_4_ = auVar90._0_4_;
                  local_a20._0_16_ = auVar235;
                  local_900._0_16_ = auVar182;
                  auVar270 = ZEXT1664(_local_9a0);
                  fVar207 = sqrtf(fVar207);
                  auVar321 = ZEXT464((uint)local_9e0._0_4_);
                  auVar338 = ZEXT464((uint)local_9c0._0_4_);
                  auVar182 = local_900._0_16_;
                  auVar235 = local_a20._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar92,auVar92);
                  fVar207 = auVar90._0_4_;
                }
                auVar90 = vdpps_avx(auVar154,auVar235,0x7f);
                local_9e0._0_4_ =
                     (local_8c0 / fVar207) * (auVar321._0_4_ + 1.0) +
                     auVar338._0_4_ + auVar321._0_4_ * local_8c0;
                auVar155 = vdpps_avx(local_a00._0_16_,auVar235,0x7f);
                auVar92 = vdpps_avx(auVar154,auVar182,0x7f);
                auVar72._4_4_ = fStack_89c;
                auVar72._0_4_ = local_8a0;
                auVar72._8_4_ = fStack_898;
                auVar72._12_4_ = aStack_894.a;
                auVar85 = vdpps_avx(auVar72,auVar235,0x7f);
                auVar91 = vdpps_avx(auVar154,local_a00._0_16_,0x7f);
                fVar207 = auVar155._0_4_ + auVar92._0_4_;
                fVar173 = auVar90._0_4_;
                auVar93._0_4_ = fVar173 * fVar173;
                auVar93._4_4_ = auVar90._4_4_ * auVar90._4_4_;
                auVar93._8_4_ = auVar90._8_4_ * auVar90._8_4_;
                auVar93._12_4_ = auVar90._12_4_ * auVar90._12_4_;
                auVar92 = vsubps_avx(auVar96,auVar93);
                local_a00._0_16_ = ZEXT416((uint)fVar207);
                auVar155 = vdpps_avx(auVar154,auVar72,0x7f);
                fVar191 = auVar91._0_4_ - fVar173 * fVar207;
                fVar173 = auVar155._0_4_ - fVar173 * auVar85._0_4_;
                auVar155 = vrsqrtss_avx(auVar92,auVar92);
                fVar221 = auVar92._0_4_;
                fVar207 = auVar155._0_4_;
                fVar207 = fVar207 * 1.5 + fVar221 * -0.5 * fVar207 * fVar207 * fVar207;
                if (fVar221 < 0.0) {
                  local_a20._0_16_ = auVar90;
                  local_900._0_16_ = auVar85;
                  local_760._0_4_ = fVar191;
                  local_780._0_4_ = fVar173;
                  local_7a0._0_4_ = fVar207;
                  auVar270 = ZEXT1664(auVar270._0_16_);
                  auVar321 = ZEXT1664(auVar321._0_16_);
                  fVar221 = sqrtf(fVar221);
                  auVar338 = ZEXT464((uint)local_9c0._0_4_);
                  fVar207 = (float)local_7a0._0_4_;
                  fVar191 = (float)local_760._0_4_;
                  fVar173 = (float)local_780._0_4_;
                  auVar85 = local_900._0_16_;
                  auVar90 = local_a20._0_16_;
                }
                else {
                  auVar155 = vsqrtss_avx(auVar92,auVar92);
                  fVar221 = auVar155._0_4_;
                }
                auVar326 = ZEXT1664(auVar285);
                auVar91 = vpermilps_avx(local_880._0_16_,0xff);
                auVar117 = vshufps_avx(auVar285,auVar285,0xff);
                fVar192 = fVar191 * fVar207 - auVar117._0_4_;
                auVar201._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
                auVar201._8_4_ = auVar85._8_4_ ^ 0x80000000;
                auVar201._12_4_ = auVar85._12_4_ ^ 0x80000000;
                auVar211._0_4_ = -fVar192;
                auVar211._4_4_ = 0x80000000;
                auVar211._8_4_ = 0x80000000;
                auVar211._12_4_ = 0x80000000;
                fVar191 = local_a00._0_4_ * fVar173 * fVar207;
                auVar242 = ZEXT464((uint)fVar191);
                auVar155 = vinsertps_avx(auVar211,ZEXT416((uint)(fVar173 * fVar207)),0x1c);
                auVar85 = vmovsldup_avx(ZEXT416((uint)(fVar191 - auVar85._0_4_ * fVar192)));
                auVar155 = vdivps_avx(auVar155,auVar85);
                auVar92 = vinsertps_avx(local_a00._0_16_,auVar201,0x10);
                auVar92 = vdivps_avx(auVar92,auVar85);
                auVar85 = vmovsldup_avx(auVar90);
                auVar94 = ZEXT416((uint)(fVar221 - auVar91._0_4_));
                auVar91 = vmovsldup_avx(auVar94);
                auVar157._0_4_ = auVar85._0_4_ * auVar155._0_4_ + auVar91._0_4_ * auVar92._0_4_;
                auVar157._4_4_ = auVar85._4_4_ * auVar155._4_4_ + auVar91._4_4_ * auVar92._4_4_;
                auVar157._8_4_ = auVar85._8_4_ * auVar155._8_4_ + auVar91._8_4_ * auVar92._8_4_;
                auVar157._12_4_ = auVar85._12_4_ * auVar155._12_4_ + auVar91._12_4_ * auVar92._12_4_
                ;
                auVar155 = vsubps_avx(auVar299,auVar157);
                auVar301 = ZEXT1664(auVar155);
                auVar158._8_4_ = 0x7fffffff;
                auVar158._0_8_ = 0x7fffffff7fffffff;
                auVar158._12_4_ = 0x7fffffff;
                auVar90 = vandps_avx(auVar90,auVar158);
                if (auVar90._0_4_ < (float)local_9e0._0_4_) {
                  auVar183._8_4_ = 0x7fffffff;
                  auVar183._0_8_ = 0x7fffffff7fffffff;
                  auVar183._12_4_ = 0x7fffffff;
                  auVar90 = vandps_avx(auVar94,auVar183);
                  if (auVar90._0_4_ <
                      (float)local_7c0._0_4_ * 1.9073486e-06 +
                      auVar338._0_4_ + (float)local_9e0._0_4_) {
                    fVar207 = auVar155._0_4_ + (float)local_850._0_4_;
                    if ((ray->super_RayK<1>).org.field_0.m128[3] <= fVar207) {
                      fVar173 = (ray->super_RayK<1>).tfar;
                      auVar242 = ZEXT464((uint)fVar173);
                      if (fVar207 <= fVar173) {
                        auVar90 = vmovshdup_avx(auVar155);
                        fVar191 = auVar90._0_4_;
                        if ((0.0 <= fVar191) && (fVar191 <= 1.0)) {
                          auVar96 = vrsqrtss_avx(auVar96,auVar96);
                          fVar221 = auVar96._0_4_;
                          pGVar7 = (context->scene->geometries).items[uVar6].ptr;
                          if ((pGVar7->mask & (ray->super_RayK<1>).mask) != 0) {
                            auVar96 = ZEXT416((uint)(fVar221 * 1.5 +
                                                    fVar220 * -0.5 * fVar221 * fVar221 * fVar221));
                            auVar96 = vshufps_avx(auVar96,auVar96,0);
                            local_a80 = auVar154._0_4_;
                            fStack_a7c = auVar154._4_4_;
                            fStack_a78 = auVar154._8_4_;
                            fStack_a74 = auVar154._12_4_;
                            auVar184._0_4_ = auVar96._0_4_ * local_a80;
                            auVar184._4_4_ = auVar96._4_4_ * fStack_a7c;
                            auVar184._8_4_ = auVar96._8_4_ * fStack_a78;
                            auVar184._12_4_ = auVar96._12_4_ * fStack_a74;
                            auVar125._0_4_ = auVar285._0_4_ + auVar117._0_4_ * auVar184._0_4_;
                            auVar125._4_4_ = auVar285._4_4_ + auVar117._4_4_ * auVar184._4_4_;
                            auVar125._8_4_ = auVar285._8_4_ + auVar117._8_4_ * auVar184._8_4_;
                            auVar125._12_4_ = auVar285._12_4_ + auVar117._12_4_ * auVar184._12_4_;
                            auVar96 = vshufps_avx(auVar184,auVar184,0xc9);
                            auVar90 = vshufps_avx(auVar285,auVar285,0xc9);
                            auVar185._0_4_ = auVar90._0_4_ * auVar184._0_4_;
                            auVar185._4_4_ = auVar90._4_4_ * auVar184._4_4_;
                            auVar185._8_4_ = auVar90._8_4_ * auVar184._8_4_;
                            auVar185._12_4_ = auVar90._12_4_ * auVar184._12_4_;
                            auVar202._0_4_ = auVar285._0_4_ * auVar96._0_4_;
                            auVar202._4_4_ = auVar285._4_4_ * auVar96._4_4_;
                            auVar202._8_4_ = auVar285._8_4_ * auVar96._8_4_;
                            auVar202._12_4_ = auVar285._12_4_ * auVar96._12_4_;
                            auVar154 = vsubps_avx(auVar202,auVar185);
                            auVar96 = vshufps_avx(auVar154,auVar154,0xc9);
                            auVar90 = vshufps_avx(auVar125,auVar125,0xc9);
                            auVar203._0_4_ = auVar90._0_4_ * auVar96._0_4_;
                            auVar203._4_4_ = auVar90._4_4_ * auVar96._4_4_;
                            auVar203._8_4_ = auVar90._8_4_ * auVar96._8_4_;
                            auVar203._12_4_ = auVar90._12_4_ * auVar96._12_4_;
                            auVar96 = vshufps_avx(auVar154,auVar154,0xd2);
                            auVar126._0_4_ = auVar125._0_4_ * auVar96._0_4_;
                            auVar126._4_4_ = auVar125._4_4_ * auVar96._4_4_;
                            auVar126._8_4_ = auVar125._8_4_ * auVar96._8_4_;
                            auVar126._12_4_ = auVar125._12_4_ * auVar96._12_4_;
                            auVar96 = vsubps_avx(auVar203,auVar126);
                            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                               (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                              (ray->super_RayK<1>).tfar = fVar207;
                              auVar90 = vshufps_avx(auVar96,auVar96,0xe9);
                              uVar2 = vmovlps_avx(auVar90);
                              *(undefined8 *)&(ray->Ng).field_0 = uVar2;
                              (ray->Ng).field_0.field_0.z = auVar96._0_4_;
                              ray->u = fVar191;
                              ray->v = 0.0;
                              ray->primID = (uint)local_920;
                              ray->geomID = uVar6;
                              ray->instID[0] = context->user->instID[0];
                              ray->instPrimID[0] = context->user->instPrimID[0];
                            }
                            else {
                              auVar90 = vshufps_avx(auVar96,auVar96,0xe9);
                              local_960 = vmovlps_avx(auVar90);
                              local_958 = auVar96._0_4_;
                              local_954 = fVar191;
                              local_950 = 0;
                              local_94c = (uint)local_920;
                              local_948 = uVar6;
                              local_944 = context->user->instID[0];
                              local_940 = context->user->instPrimID[0];
                              (ray->super_RayK<1>).tfar = fVar207;
                              local_a24 = -1;
                              local_a58.valid = &local_a24;
                              local_a58.geometryUserPtr = pGVar7->userPtr;
                              local_a58.context = context->user;
                              local_a58.hit = (RTCHitN *)&local_960;
                              local_a58.N = 1;
                              local_a58.ray = (RTCRayN *)ray;
                              if (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e162af:
                                p_Var8 = context->args->filter;
                                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  auVar242 = ZEXT1664(auVar242._0_16_);
                                  auVar270 = ZEXT1664(auVar270._0_16_);
                                  auVar301 = ZEXT1664(auVar301._0_16_);
                                  auVar321 = ZEXT1664(auVar321._0_16_);
                                  auVar326 = ZEXT1664(auVar326._0_16_);
                                  auVar338 = ZEXT1664(auVar338._0_16_);
                                  (*p_Var8)(&local_a58);
                                  if (*local_a58.valid == 0) goto LAB_00e16344;
                                }
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).components[0] =
                                     *(float *)local_a58.hit;
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.y =
                                     *(float *)(local_a58.hit + 4);
                                (((Vec3f *)((long)local_a58.ray + 0x30))->field_0).field_0.z =
                                     *(float *)(local_a58.hit + 8);
                                *(float *)((long)local_a58.ray + 0x3c) =
                                     *(float *)(local_a58.hit + 0xc);
                                *(float *)((long)local_a58.ray + 0x40) =
                                     *(float *)(local_a58.hit + 0x10);
                                *(float *)((long)local_a58.ray + 0x44) =
                                     *(float *)(local_a58.hit + 0x14);
                                *(float *)((long)local_a58.ray + 0x48) =
                                     *(float *)(local_a58.hit + 0x18);
                                *(float *)((long)local_a58.ray + 0x4c) =
                                     *(float *)(local_a58.hit + 0x1c);
                                *(float *)((long)local_a58.ray + 0x50) =
                                     *(float *)(local_a58.hit + 0x20);
                              }
                              else {
                                auVar242 = ZEXT464((uint)fVar173);
                                auVar270 = ZEXT1664(auVar270._0_16_);
                                auVar301 = ZEXT1664(auVar155);
                                auVar321 = ZEXT1664(auVar321._0_16_);
                                auVar326 = ZEXT1664(auVar285);
                                auVar338 = ZEXT1664(auVar338._0_16_);
                                (*pGVar7->intersectionFilterN)(&local_a58);
                                if (*local_a58.valid != 0) goto LAB_00e162af;
LAB_00e16344:
                                (ray->super_RayK<1>).tfar = fVar173;
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar76 = lVar76 + -1;
              } while (lVar76 != 0);
              auVar98 = local_700;
              fVar207 = (ray->super_RayK<1>).tfar;
              auVar102._4_4_ = fVar207;
              auVar102._0_4_ = fVar207;
              auVar102._8_4_ = fVar207;
              auVar102._12_4_ = fVar207;
              auVar102._16_4_ = fVar207;
              auVar102._20_4_ = fVar207;
              auVar102._24_4_ = fVar207;
              auVar102._28_4_ = fVar207;
              auVar97 = vcmpps_avx(_local_800,auVar102,2);
              local_700 = vandps_avx(auVar97,local_700);
              auVar98 = auVar98 & auVar97;
            } while ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar98 >> 0x7f,0) != '\0') ||
                       (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar98 >> 0xbf,0) != '\0') ||
                     (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar98[0x1f] < '\0');
          }
          auVar97 = vandps_avx(_local_6a0,local_5a0);
          auVar98 = vandps_avx(_local_840,_local_820);
          auVar204._0_4_ = (float)local_720._0_4_ + local_4c0._0_4_;
          auVar204._4_4_ = (float)local_720._4_4_ + local_4c0._4_4_;
          auVar204._8_4_ = fStack_718 + local_4c0._8_4_;
          auVar204._12_4_ = fStack_714 + local_4c0._12_4_;
          auVar204._16_4_ = fStack_710 + local_4c0._16_4_;
          auVar204._20_4_ = fStack_70c + local_4c0._20_4_;
          auVar204._24_4_ = fStack_708 + local_4c0._24_4_;
          auVar204._28_4_ = fStack_704 + local_4c0._28_4_;
          auVar19 = vcmpps_avx(auVar204,auVar102,2);
          auVar97 = vandps_avx(auVar19,auVar97);
          auVar205._0_4_ = local_500._0_4_ + (float)local_720._0_4_;
          auVar205._4_4_ = local_500._4_4_ + (float)local_720._4_4_;
          auVar205._8_4_ = local_500._8_4_ + fStack_718;
          auVar205._12_4_ = local_500._12_4_ + fStack_714;
          auVar205._16_4_ = local_500._16_4_ + fStack_710;
          auVar205._20_4_ = local_500._20_4_ + fStack_70c;
          auVar205._24_4_ = local_500._24_4_ + fStack_708;
          auVar205._28_4_ = local_500._28_4_ + fStack_704;
          auVar19 = vcmpps_avx(auVar205,auVar102,2);
          auVar98 = vandps_avx(auVar19,auVar98);
          auVar98 = vorps_avx(auVar97,auVar98);
          uVar79 = (uint)local_920;
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0x7f,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0xbf,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar98[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar82 * 0x60) = auVar98;
            auVar97 = vblendvps_avx(_local_500,local_4c0,auVar97);
            *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x60) = auVar97;
            uVar2 = vmovlps_avx(local_510);
            (&uStack_140)[uVar82 * 0xc] = uVar2;
            aiStack_138[uVar82 * 0x18] = local_aec + 1;
            iVar84 = iVar84 + 1;
          }
        }
      }
    }
    if (iVar84 == 0) break;
    fVar207 = (ray->super_RayK<1>).tfar;
    auVar134._4_4_ = fVar207;
    auVar134._0_4_ = fVar207;
    auVar134._8_4_ = fVar207;
    auVar134._12_4_ = fVar207;
    auVar134._16_4_ = fVar207;
    auVar134._20_4_ = fVar207;
    auVar134._24_4_ = fVar207;
    auVar134._28_4_ = fVar207;
    uVar80 = -iVar84;
    pauVar78 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar84 - 1) * 0x60);
    while( true ) {
      auVar97 = pauVar78[1];
      auVar169._0_4_ = auVar97._0_4_ + (float)local_720._0_4_;
      auVar169._4_4_ = auVar97._4_4_ + (float)local_720._4_4_;
      auVar169._8_4_ = auVar97._8_4_ + fStack_718;
      auVar169._12_4_ = auVar97._12_4_ + fStack_714;
      auVar169._16_4_ = auVar97._16_4_ + fStack_710;
      auVar169._20_4_ = auVar97._20_4_ + fStack_70c;
      auVar169._24_4_ = auVar97._24_4_ + fStack_708;
      auVar169._28_4_ = auVar97._28_4_ + fStack_704;
      auVar19 = vcmpps_avx(auVar169,auVar134,2);
      auVar219 = ZEXT3264(auVar19);
      auVar98 = vandps_avx(auVar19,*pauVar78);
      local_4c0 = auVar98;
      auVar19 = *pauVar78 & auVar19;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') break;
      pauVar78 = pauVar78 + -3;
      uVar80 = uVar80 + 1;
      if (uVar80 == 0) goto LAB_00e1661d;
    }
    auVar105._8_4_ = 0x7f800000;
    auVar105._0_8_ = 0x7f8000007f800000;
    auVar105._12_4_ = 0x7f800000;
    auVar105._16_4_ = 0x7f800000;
    auVar105._20_4_ = 0x7f800000;
    auVar105._24_4_ = 0x7f800000;
    auVar105._28_4_ = 0x7f800000;
    auVar97 = vblendvps_avx(auVar105,auVar97,auVar98);
    auVar19 = vshufps_avx(auVar97,auVar97,0xb1);
    auVar19 = vminps_avx(auVar97,auVar19);
    auVar20 = vshufpd_avx(auVar19,auVar19,5);
    auVar19 = vminps_avx(auVar19,auVar20);
    auVar20 = vperm2f128_avx(auVar19,auVar19,1);
    auVar19 = vminps_avx(auVar19,auVar20);
    auVar97 = vcmpps_avx(auVar97,auVar19,0);
    auVar19 = auVar98 & auVar97;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0x7f,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar19 >> 0xbf,0) != '\0') ||
        (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar19[0x1f] < '\0')
    {
      auVar98 = vandps_avx(auVar97,auVar98);
    }
    auVar95._8_8_ = 0;
    auVar95._0_8_ = *(ulong *)pauVar78[2];
    local_aec = *(uint *)(pauVar78[2] + 8);
    uVar81 = vmovmskps_avx(auVar98);
    uVar9 = 0;
    if (uVar81 != 0) {
      for (; (uVar81 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    *(undefined4 *)(local_4c0 + (ulong)uVar9 * 4) = 0;
    *pauVar78 = local_4c0;
    uVar81 = ~uVar80;
    if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4c0 >> 0x7f,0) != '\0') ||
          (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4c0 >> 0xbf,0) != '\0') ||
        (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4c0[0x1f] < '\0') {
      uVar81 = -uVar80;
    }
    uVar82 = (ulong)uVar81;
    auVar96 = vshufps_avx(auVar95,auVar95,0);
    auVar90 = vshufps_avx(auVar95,auVar95,0x55);
    auVar90 = vsubps_avx(auVar90,auVar96);
    local_500._4_4_ = auVar96._4_4_ + auVar90._4_4_ * 0.14285715;
    local_500._0_4_ = auVar96._0_4_ + auVar90._0_4_ * 0.0;
    fStack_4f8 = auVar96._8_4_ + auVar90._8_4_ * 0.2857143;
    fStack_4f4 = auVar96._12_4_ + auVar90._12_4_ * 0.42857146;
    fStack_4f0 = auVar96._0_4_ + auVar90._0_4_ * 0.5714286;
    fStack_4ec = auVar96._4_4_ + auVar90._4_4_ * 0.71428573;
    fStack_4e8 = auVar96._8_4_ + auVar90._8_4_ * 0.8571429;
    fStack_4e4 = auVar96._12_4_ + auVar90._12_4_;
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_500 + (ulong)uVar9 * 4);
  } while( true );
LAB_00e1661d:
  auVar96 = SUB3216(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vcmpps_avx(local_520,auVar96,2);
  uVar79 = vmovmskps_avx(auVar96);
  uVar79 = (uint)uVar83 & uVar79;
  if (uVar79 == 0) {
    return;
  }
  goto LAB_00e13cbc;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }